

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O2

MPP_RET init_picture(H264_SLICE_t *currSlice)

{
  RK_S32 *pRVar1;
  RK_S32 *pRVar2;
  RK_U8 *pRVar3;
  RK_U8 *list_size;
  h264_store_pic_t **pphVar4;
  h264_store_pic_t **pphVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  MppFrameFormat MVar8;
  RK_S32 RVar9;
  RK_S32 RVar10;
  H264dVideoCtx_t *p_Vid;
  h264_dec_ctx_t *phVar11;
  h264_sps_t *phVar12;
  h264_dpb_buf_t *phVar13;
  h264_sps_t *phVar14;
  H264dVideoCtx_t *pHVar15;
  h264_dpb_buf_t *phVar16;
  h264_dpb_mark_t *phVar17;
  H264_FrameStore_t *pHVar18;
  H264_DecCtx_t *pHVar19;
  h264_dec_ctx_t *phVar20;
  MppFrame pvVar21;
  undefined8 uVar22;
  h264_sei_t *phVar23;
  undefined8 uVar24;
  h264d_cur_ctx_t *phVar25;
  h264d_video_ctx_t *phVar26;
  h264_store_pic_t **pphVar27;
  h264d_dxva_ctx_t *phVar28;
  RK_S32 RVar29;
  RK_S64 RVar30;
  undefined1 auVar31 [16];
  h264_dpb_info_t *phVar32;
  ushort uVar33;
  RK_U32 RVar34;
  RK_U32 RVar35;
  int iVar36;
  int iVar37;
  H264_StorePic_t *p;
  H264_FrameStore_t **ppHVar38;
  H264_FrameStore_t **ppHVar39;
  H264_FrameStore_t **fs_list;
  long lVar40;
  H264_FrameStore_t **ppHVar41;
  h264_frame_store_t **pphVar42;
  MppBuffer buffer;
  ushort uVar43;
  uint uVar44;
  RK_U32 RVar45;
  int iVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  h264_refpic_info_t *phVar50;
  HalDecTask *pHVar51;
  h264_store_pic_t *phVar52;
  ulong uVar53;
  char *pcVar54;
  MppFrameFormat MVar55;
  int iVar56;
  MppFrameFormat MVar57;
  MppFrame s;
  long lVar58;
  RK_S32 *pRVar59;
  uint uVar60;
  RK_S32 *pRVar61;
  undefined8 uVar62;
  h264_frame_store_t *phVar63;
  h264_dpb_info_t *phVar64;
  RK_U32 *pRVar65;
  int iVar66;
  h264_dpb_mark_t *phVar67;
  byte bVar68;
  RK_S32 *pRVar69;
  RK_S32 RVar70;
  h264_store_pic_t *phVar71;
  size_t sVar72;
  uint uVar73;
  uint uVar74;
  bool bVar75;
  undefined8 uVar76;
  H264_StorePic_t *local_c0;
  RK_S32 *local_b8;
  undefined4 local_a0;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  p_Vid = currSlice->p_Vid;
  phVar11 = p_Vid->p_Dec;
  RVar34 = (phVar11->errctx).i_slice_no;
  if ((((RVar34 == 0) && ((p_Vid->recovery).valid_flag != 0)) &&
      ((p_Vid->recovery).first_frm_valid != 0)) &&
     ((p_Vid->recovery).first_frm_id == currSlice->frame_num)) {
    uVar44 = (uint)(currSlice->layer_id == 0);
  }
  else {
    uVar44 = 0;
    if (currSlice->layer_id == 0) {
      uVar44 = (uint)(currSlice->slice_type == 2);
    }
    uVar44 = uVar44 + RVar34;
  }
  (phVar11->errctx).i_slice_no = uVar44;
  if (uVar44 == 0) {
    if ((h264d_debug & 4) == 0) {
      return MPP_NOK;
    }
    _mpp_log_l(4,"h264d_init","[Discard] Discard slice before I Slice. \n",(char *)0x0);
    return MPP_NOK;
  }
  phVar12 = p_Vid->active_sps;
  phVar13 = currSlice->p_Dpb;
  local_c0 = alloc_storable_picture(p_Vid,currSlice->structure);
  if (local_c0 == (H264_StorePic_t *)0x0) {
    local_b8._0_4_ = MPP_ERR_MALLOC;
    if ((h264d_debug & 1) != 0) {
      pcVar54 = "malloc buffer error(%d).\n";
      uVar62 = 0x28a;
LAB_00191379:
      _mpp_log_l(4,"h264d_init",pcVar54,(char *)0x0,uVar62);
    }
  }
  else {
    iVar46 = currSlice->layer_id;
    iVar37 = p_Vid->last_toppoc[iVar46];
    pRVar59 = &currSlice->toppoc;
    currSlice->toppoc = iVar37;
    iVar56 = p_Vid->last_bottompoc[iVar46];
    pRVar69 = &currSlice->bottompoc;
    currSlice->bottompoc = iVar56;
    pRVar1 = &currSlice->framepoc;
    currSlice->framepoc = p_Vid->last_framepoc[iVar46];
    currSlice->ThisPOC = p_Vid->last_thispoc[iVar46];
    phVar14 = p_Vid->active_sps;
    uVar44 = 1 << ((char)phVar14->log2_max_pic_order_cnt_lsb_minus4 + 4U & 0x1f);
    pRVar2 = &currSlice->ThisPOC;
    iVar36 = phVar14->pic_order_cnt_type;
    local_b8._0_4_ = MPP_ERR_VALUE;
    if (iVar36 == 2) {
      if (currSlice->idr_flag == 0) {
        if (p_Vid->last_has_mmco_5 == 0) {
          RVar35 = p_Vid->PreviousFrameNum;
          RVar34 = p_Vid->PreviousFrameNumOffset;
        }
        else {
          p_Vid->PreviousFrameNum = 0;
          p_Vid->PreviousFrameNumOffset = 0;
          RVar34 = 0;
          RVar35 = 0;
        }
        RVar45 = currSlice->frame_num;
        if ((int)RVar45 < (int)RVar35) {
          RVar34 = RVar34 + p_Vid->max_frame_num;
        }
        p_Vid->FrameNumOffset = RVar34;
        currSlice->AbsFrameNum = RVar34 + RVar45;
        iVar36 = (RVar34 + RVar45) * 2 - (uint)(currSlice->nal_reference_idc == 0);
        currSlice->ThisPOC = iVar36;
        if (currSlice->field_pic_flag == 0) {
          *pRVar1 = iVar36;
          *pRVar69 = iVar36;
          *pRVar59 = iVar36;
          iVar37 = iVar36;
          iVar56 = iVar36;
        }
        else {
          currSlice->framepoc = iVar36;
          if (currSlice->bottom_field_flag == 0) {
            *pRVar59 = iVar36;
            iVar37 = iVar36;
          }
          else {
            *pRVar69 = iVar36;
            iVar56 = iVar36;
          }
        }
      }
      else {
        p_Vid->FrameNumOffset = 0;
        currSlice->ThisPOC = 0;
        currSlice->toppoc = 0;
        currSlice->bottompoc = 0;
        currSlice->framepoc = 0;
        if (currSlice->frame_num != 0) {
          uVar62 = 0xa1;
          if ((h264d_debug & 4) != 0) {
LAB_00191335:
            _mpp_log_l(4,"h264d_init","value error(%d).\n",(char *)0x0,uVar62);
          }
          goto LAB_00191354;
        }
        iVar36 = 0;
        RVar34 = 0;
        RVar45 = 0;
        iVar37 = 0;
        iVar56 = 0;
      }
LAB_0019177f:
      p_Vid->PreviousFrameNum = RVar45;
      lVar47 = 0xcc8;
LAB_0019178b:
      *(RK_U32 *)((long)p_Vid->spsSet + lVar47) = RVar34;
    }
    else {
      if (iVar36 == 1) {
        if (currSlice->idr_flag == 0) {
          if (p_Vid->last_has_mmco_5 == 0) {
            RVar35 = p_Vid->PreviousFrameNum;
            RVar34 = p_Vid->PreviousFrameNumOffset;
          }
          else {
            p_Vid->PreviousFrameNumOffset = 0;
            p_Vid->PreviousFrameNum = 0;
            RVar34 = 0;
            RVar35 = 0;
          }
          RVar45 = currSlice->frame_num;
          if ((int)RVar45 < (int)RVar35) {
            RVar34 = RVar34 + p_Vid->max_frame_num;
          }
          p_Vid->FrameNumOffset = RVar34;
        }
        else {
          p_Vid->FrameNumOffset = 0;
          if (currSlice->frame_num != 0) {
            if ((h264d_debug & 4) != 0) {
              uVar62 = 0x62;
              goto LAB_00191335;
            }
            goto LAB_00191354;
          }
          RVar45 = 0;
          RVar34 = 0;
        }
        uVar44 = phVar14->num_ref_frames_in_pic_order_cnt_cycle;
        RVar35 = RVar34 + RVar45;
        if (uVar44 == 0) {
          RVar35 = 0;
        }
        currSlice->AbsFrameNum = RVar35;
        iVar36 = currSlice->nal_reference_idc;
        if (iVar36 == 0) {
          if (RVar35 == 0) {
            RVar35 = 0;
          }
          else {
            RVar35 = RVar35 - 1;
            currSlice->AbsFrameNum = RVar35;
          }
        }
        p_Vid->ExpectedDeltaPerPicOrderCntCycle = 0;
        iVar66 = 0;
        if (uVar44 != 0) {
          uVar48 = 0;
          if (0 < (int)uVar44) {
            uVar48 = (ulong)uVar44;
          }
          for (uVar49 = 0; uVar48 != uVar49; uVar49 = uVar49 + 1) {
            iVar66 = iVar66 + phVar14->offset_for_ref_frame[uVar49];
            p_Vid->ExpectedDeltaPerPicOrderCntCycle = iVar66;
          }
        }
        if (RVar35 == 0) {
          p_Vid->ExpectedPicOrderCnt = 0;
          iVar66 = 0;
        }
        else {
          uVar73 = (RVar35 - 1) / uVar44;
          uVar44 = (RVar35 - 1) % uVar44;
          p_Vid->PicOrderCntCycleCnt = uVar73;
          p_Vid->FrameNumInPicOrderCntCycle = uVar44;
          iVar66 = iVar66 * uVar73;
          p_Vid->ExpectedPicOrderCnt = iVar66;
          for (lVar47 = 0; lVar47 <= (int)uVar44; lVar47 = lVar47 + 1) {
            iVar66 = iVar66 + phVar14->offset_for_ref_frame[lVar47];
            p_Vid->ExpectedPicOrderCnt = iVar66;
          }
        }
        if (iVar36 == 0) {
          iVar66 = iVar66 + phVar14->offset_for_non_ref_pic;
          p_Vid->ExpectedPicOrderCnt = iVar66;
        }
        if (currSlice->field_pic_flag == 0) {
          iVar37 = iVar66 + currSlice->delta_pic_order_cnt[0];
          currSlice->toppoc = iVar37;
          iVar56 = phVar14->offset_for_top_to_bottom_field + iVar37 +
                   currSlice->delta_pic_order_cnt[1];
          currSlice->bottompoc = iVar56;
          iVar36 = iVar56;
          if (iVar37 < iVar56) {
            iVar36 = iVar37;
          }
        }
        else if (currSlice->bottom_field_flag == 0) {
          iVar37 = iVar66 + currSlice->delta_pic_order_cnt[0];
          currSlice->toppoc = iVar37;
          iVar36 = iVar37;
        }
        else {
          iVar56 = iVar66 + phVar14->offset_for_top_to_bottom_field +
                   currSlice->delta_pic_order_cnt[0];
          currSlice->bottompoc = iVar56;
          iVar36 = iVar56;
        }
        *pRVar2 = iVar36;
        *pRVar1 = iVar36;
        goto LAB_0019177f;
      }
      if (iVar36 != 0) {
        local_b8._0_4_ = MPP_NOK;
LAB_00191354:
        if ((h264d_debug & 4) != 0) {
          pcVar54 = "Function error(%d).\n";
          uVar62 = 0x28f;
          goto LAB_00191379;
        }
        goto LAB_00191380;
      }
      if (currSlice->idr_flag == 0) {
        if (p_Vid->last_has_mmco_5 == 0) {
          RVar70 = p_Vid->PrevPicOrderCntLsb;
        }
        else {
          p_Vid->PrevPicOrderCntMsb = 0;
          if (p_Vid->last_pic_bottom_field != 0) {
            p_Vid->PrevPicOrderCntLsb = 0;
            goto LAB_001911dc;
          }
          p_Vid->PrevPicOrderCntLsb = iVar37;
          RVar70 = iVar37;
        }
      }
      else {
        p_Vid->PrevPicOrderCntMsb = 0;
        p_Vid->PrevPicOrderCntLsb = 0;
LAB_001911dc:
        RVar70 = 0;
      }
      iVar66 = currSlice->pic_order_cnt_lsb;
      if ((iVar66 < RVar70) && ((int)(uVar44 >> 1) <= RVar70 - iVar66)) {
        RVar34 = uVar44 + p_Vid->PrevPicOrderCntMsb;
      }
      else if ((RVar70 < iVar66) && ((int)(uVar44 >> 1) < iVar66 - RVar70)) {
        RVar34 = p_Vid->PrevPicOrderCntMsb - uVar44;
      }
      else {
        RVar34 = p_Vid->PrevPicOrderCntMsb;
      }
      currSlice->PicOrderCntMsb = RVar34;
      if (currSlice->field_pic_flag == 0) {
        iVar37 = RVar34 + iVar66;
        currSlice->toppoc = iVar37;
        iVar56 = currSlice->delta_pic_order_cnt_bottom + iVar37;
        currSlice->bottompoc = iVar56;
        iVar36 = iVar56;
        if (0 < currSlice->delta_pic_order_cnt_bottom) {
          iVar36 = iVar37;
        }
      }
      else {
        iVar36 = RVar34 + iVar66;
        if (currSlice->bottom_field_flag == 0) {
          *pRVar59 = iVar36;
          iVar37 = iVar36;
        }
        else {
          *pRVar69 = iVar36;
          iVar56 = iVar36;
        }
      }
      currSlice->ThisPOC = iVar36;
      currSlice->framepoc = iVar36;
      p_Vid->ThisPOC = iVar36;
      p_Vid->PreviousFrameNum = currSlice->frame_num;
      if (currSlice->nal_reference_idc != 0) {
        p_Vid->PrevPicOrderCntLsb = iVar66;
        lVar47 = 0xcb8;
        goto LAB_0019178b;
      }
    }
    local_c0->top_poc = iVar37;
    local_c0->bottom_poc = iVar56;
    local_c0->frame_poc = iVar36;
    local_c0->ThisPOC = iVar36;
    p_Vid->last_toppoc[iVar46] = iVar37;
    p_Vid->last_bottompoc[currSlice->layer_id] = currSlice->bottompoc;
    p_Vid->last_framepoc[currSlice->layer_id] = currSlice->framepoc;
    p_Vid->last_thispoc[currSlice->layer_id] = currSlice->ThisPOC;
    iVar37 = currSlice->structure;
    if (iVar37 == 3) {
      if (currSlice->mb_aff_frame_flag == 0) {
        local_c0->iCodingType = 0;
      }
      else {
        local_c0->iCodingType = 3;
      }
    }
    else {
      local_c0->iCodingType = 1;
    }
    iVar56 = currSlice->layer_id;
    local_c0->layer_id = iVar56;
    local_c0->view_id = currSlice->view_id;
    uVar6 = currSlice->anchor_pic_flag;
    uVar7 = currSlice->inter_view_flag;
    local_c0->inter_view_flag = uVar7;
    local_c0->anchor_pic_flag = uVar6;
    if ((iVar56 == 1) && ((p_Vid->profile_idc == 0x80 || (p_Vid->profile_idc == 0x76)))) {
      pHVar15 = currSlice->p_Vid;
      phVar16 = pHVar15->p_Dpb_layer[0];
      uVar48 = (ulong)phVar16->used_size;
      uVar49 = 0;
      if (iVar37 == 3) {
        phVar52 = (h264_store_pic_t *)0x0;
        for (; uVar48 != uVar49; uVar49 = uVar49 + 1) {
          phVar71 = phVar16->fs[uVar49]->frame;
          if ((phVar71 != (h264_store_pic_t *)0x0) && (phVar71->layer_id == 0)) {
            bVar75 = phVar71->is_mmco_5 != '\0';
            pRVar61 = &phVar71->poc;
            if (bVar75) {
              pRVar61 = &phVar71->poc_mmco5;
            }
            if (*pRVar61 == *pRVar1) {
              phVar52 = phVar71;
            }
            if (*pRVar61 == *pRVar1 && !bVar75) goto LAB_001919f0;
          }
        }
      }
      else if (iVar37 == 1) {
        phVar52 = (h264_store_pic_t *)0x0;
        for (; uVar48 != uVar49; uVar49 = uVar49 + 1) {
          phVar71 = phVar16->fs[uVar49]->top_field;
          if ((phVar71 != (h264_store_pic_t *)0x0) && (phVar71->layer_id == 0)) {
            bVar75 = phVar71->is_mmco_5 != '\0';
            pRVar61 = &phVar71->top_poc;
            if (bVar75) {
              pRVar61 = &phVar71->top_poc_mmco5;
            }
            if (*pRVar61 == *pRVar59) {
              phVar52 = phVar71;
            }
            if (*pRVar61 == *pRVar59 && !bVar75) goto LAB_001919f0;
          }
        }
      }
      else {
        phVar52 = (h264_store_pic_t *)0x0;
        for (; uVar48 != uVar49; uVar49 = uVar49 + 1) {
          phVar71 = phVar16->fs[uVar49]->bottom_field;
          if ((phVar71 != (h264_store_pic_t *)0x0) && (phVar71->layer_id == 0)) {
            bVar75 = phVar71->is_mmco_5 != '\0';
            pRVar61 = &phVar71->bottom_poc;
            if (bVar75) {
              pRVar61 = &phVar71->bot_poc_mmco5;
            }
            if (*pRVar61 == *pRVar69) {
              phVar52 = phVar71;
            }
            if (*pRVar61 == *pRVar69 && !bVar75) goto LAB_001919f0;
          }
        }
      }
      phVar71 = phVar52;
      if (phVar52 != (h264_store_pic_t *)0x0) {
LAB_001919f0:
        p = alloc_storable_picture(pHVar15,pHVar15->structure);
        if (p == (H264_StorePic_t *)0x0) {
          if (((h264d_debug & 1) != 0) &&
             (_mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x104),
             (h264d_debug & 1) != 0)) {
            _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x174);
          }
          local_b8._0_4_ = MPP_ERR_MALLOC;
        }
        else {
          p->mem_malloc_type = Mem_Clone;
          phVar17 = phVar71->mem_mark;
          p->mem_mark = phVar17;
          uVar44 = p->structure;
          if ((uVar44 & 0xfffffffd) == 1) {
            phVar17->top_used = phVar17->top_used + '\x01';
          }
          if ((uVar44 & 0xfffffffe) == 2) {
            phVar17->bot_used = phVar17->bot_used + '\x01';
          }
          p->colmv_no_used_flag = '\x01';
          RVar70 = phVar71->pic_num;
          RVar34 = phVar71->frame_num;
          RVar9 = phVar71->long_term_frame_idx;
          p->long_term_pic_num = phVar71->long_term_pic_num;
          p->long_term_frame_idx = RVar9;
          p->is_long_term = '\0';
          p->non_existing = phVar71->non_existing;
          p->max_slice_id = phVar71->max_slice_id;
          p->mb_aff_frame_flag = phVar71->mb_aff_frame_flag;
          iVar56 = phVar71->structure;
          RVar9 = phVar71->poc;
          RVar10 = phVar71->top_poc;
          RVar29 = phVar71->bottom_poc;
          p->structure = iVar56;
          p->poc = RVar9;
          p->top_poc = RVar10;
          p->bottom_poc = RVar29;
          p->frame_poc = phVar71->frame_poc;
          p->is_mmco_5 = phVar71->is_mmco_5;
          RVar9 = phVar71->top_poc_mmco5;
          p->poc_mmco5 = phVar71->poc_mmco5;
          p->top_poc_mmco5 = RVar9;
          p->bot_poc_mmco5 = phVar71->bot_poc_mmco5;
          p->pic_num = RVar70;
          p->frame_num = RVar34;
          RVar70 = phVar71->idr_flag;
          p->slice_type = phVar71->slice_type;
          p->idr_flag = RVar70;
          p->no_output_of_prior_pics_flag = phVar71->no_output_of_prior_pics_flag;
          p->long_term_reference_flag = 0;
          p->adaptive_ref_pic_buffering_flag = 0;
          p->dec_ref_pic_marking_buffer = (h264_drpm_t *)0x0;
          p->PicWidthInMbs = phVar71->PicWidthInMbs;
          RVar70 = phVar71->frame_mbs_only_flag;
          p->chroma_format_idc = phVar71->chroma_format_idc;
          p->frame_mbs_only_flag = RVar70;
          iVar37 = phVar71->frame_cropping_flag;
          p->frame_cropping_flag = iVar37;
          if (iVar37 != 0) {
            RVar70 = phVar71->frame_crop_right_offset;
            RVar9 = phVar71->frame_crop_top_offset;
            RVar10 = phVar71->frame_crop_bottom_offset;
            p->frame_crop_left_offset = phVar71->frame_crop_left_offset;
            p->frame_crop_right_offset = RVar70;
            p->frame_crop_top_offset = RVar9;
            p->frame_crop_bottom_offset = RVar10;
          }
          p->anchor_pic_flag = 0;
          RVar70 = phVar71->inter_view_flag;
          p->view_id = phVar71->view_id;
          p->inter_view_flag = RVar70;
          p->layer_id = phVar71->layer_id;
          p->proc_flag = 1;
          p->used_for_reference = 1;
          p->is_output = 1;
          phVar16 = currSlice->p_Dpb;
          pHVar15 = phVar16->p_Vid;
          pHVar18 = *phVar16->fs_ilref;
          if (phVar16->used_size_il == 0) {
            if (pHVar18->is_used < 1) goto LAB_00191bda;
            if (iVar56 != 1) {
              if (iVar56 == 2) {
                if (pHVar18->bottom_field != (h264_store_pic_t *)0x0) {
                  local_b8._0_4_ = MPP_ERR_VALUE;
                  if ((h264d_debug & 4) != 0) {
                    pcVar54 = "value error(%d).\n";
                    uVar62 = 0xe6;
                    goto LAB_00191ca8;
                  }
                  goto LAB_00191caf;
                }
                goto LAB_00191bda;
              }
              if ((iVar56 != 3) || (pHVar18->frame == (h264_store_pic_t *)0x0)) goto LAB_00191bda;
              local_b8._0_4_ = MPP_ERR_VALUE;
              if ((h264d_debug & 4) == 0) goto LAB_00191caf;
              pcVar54 = "value error(%d).\n";
              uVar62 = 0xe2;
              goto LAB_00191ca8;
            }
            if (pHVar18->top_field == (h264_store_pic_t *)0x0) goto LAB_00191bda;
            local_b8._0_4_ = MPP_ERR_VALUE;
            if ((h264d_debug & 4) != 0) {
              pcVar54 = "value error(%d).\n";
              uVar62 = 0xe4;
              goto LAB_00191ca8;
            }
          }
          else {
            pHVar19 = pHVar15->p_Dec;
            if (pHVar18->frame != (H264_StorePic_t *)0x0) {
              free_storable_picture(pHVar19,pHVar18->frame);
              pHVar18->frame = (h264_store_pic_t *)0x0;
            }
            if (pHVar18->top_field != (H264_StorePic_t *)0x0) {
              free_storable_picture(pHVar19,pHVar18->top_field);
              pHVar18->top_field = (h264_store_pic_t *)0x0;
            }
            if (pHVar18->bottom_field != (H264_StorePic_t *)0x0) {
              free_storable_picture(pHVar19,pHVar18->bottom_field);
              pHVar18->bottom_field = (h264_store_pic_t *)0x0;
            }
            pHVar18->is_used = 0;
            pHVar18->is_reference = 0;
            phVar16->used_size_il = phVar16->used_size_il - 1;
LAB_00191bda:
            local_b8._0_4_ = insert_picture_in_dpb(pHVar15,pHVar18,p,'\0');
            if (MPP_NOK < (MPP_RET)local_b8) {
              iVar37 = pHVar18->is_used;
              if (p->structure == 3) {
                bVar75 = iVar37 == 3;
              }
              else {
                bVar75 = iVar37 < 3 && iVar37 != 0;
              }
              if (bVar75) {
                phVar16->used_size_il = phVar16->used_size_il + 1;
              }
              goto LAB_00191d83;
            }
            if ((h264d_debug & 4) != 0) {
              pcVar54 = "Function error(%d).\n";
              uVar62 = 0xe9;
LAB_00191ca8:
              _mpp_log_l(4,"h264d_init",pcVar54,(char *)0x0,uVar62);
            }
          }
LAB_00191caf:
          if ((h264d_debug & 4) != 0) {
            _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,0x175);
          }
        }
        if ((h264d_debug & 4) != 0) {
          pcVar54 = "Function error(%d).\n";
          uVar62 = 0x2aa;
          goto LAB_00191379;
        }
        goto LAB_00191380;
      }
    }
LAB_00191d83:
    iVar37 = currSlice->structure;
    local_b8._0_4_ = MPP_NOK;
    if (((iVar37 == 1) || (pRVar59 = pRVar1, iVar37 == 3)) || (pRVar59 = pRVar69, iVar37 == 2)) {
      local_b8 = pRVar59;
      local_c0->poc = *local_b8;
      local_c0->slice_type = p_Vid->type;
      local_c0->used_for_reference = (uint)(currSlice->nal_reference_idc != 0);
      local_c0->idr_flag = currSlice->idr_flag;
      RVar70 = currSlice->long_term_reference_flag;
      local_c0->no_output_of_prior_pics_flag = currSlice->no_output_of_prior_pics_flag;
      local_c0->long_term_reference_flag = RVar70;
      local_c0->adaptive_ref_pic_buffering_flag = currSlice->adaptive_ref_pic_buffering_flag;
      local_c0->dec_ref_pic_marking_buffer = currSlice->dec_ref_pic_marking_buffer;
      currSlice->dec_ref_pic_marking_buffer = (h264_drpm_t *)0x0;
      local_c0->mb_aff_frame_flag = currSlice->mb_aff_frame_flag;
      local_c0->PicWidthInMbs = p_Vid->PicWidthInMbs;
      RVar34 = currSlice->frame_num;
      local_c0->pic_num = RVar34;
      local_c0->frame_num = RVar34;
      local_c0->chroma_format_idc = phVar12->chroma_format_idc;
      local_c0->frame_mbs_only_flag = phVar12->frame_mbs_only_flag;
      iVar37 = phVar12->frame_cropping_flag;
      local_c0->frame_cropping_flag = iVar37;
      if (iVar37 == 0) {
        uVar62 = 0;
        uVar76 = 0;
      }
      else {
        uVar62._0_4_ = phVar12->frame_crop_left_offset;
        uVar62._4_4_ = phVar12->frame_crop_right_offset;
        uVar76._0_4_ = phVar12->frame_crop_top_offset;
        uVar76._4_4_ = phVar12->frame_crop_bottom_offset;
      }
      local_c0->frame_crop_left_offset = (int)uVar62;
      local_c0->frame_crop_right_offset = (int)((ulong)uVar62 >> 0x20);
      local_c0->frame_crop_top_offset = (int)uVar76;
      local_c0->frame_crop_bottom_offset = (int)((ulong)uVar76 >> 0x20);
      RVar70 = p_Vid->height;
      RVar34 = p_Vid->width_after_crop;
      RVar35 = p_Vid->height_after_crop;
      local_c0->width = p_Vid->width;
      local_c0->height = RVar70;
      local_c0->width_after_crop = RVar34;
      local_c0->height_after_crop = RVar35;
      RVar34 = get_field_dpb_combine_flag(phVar13->last_picture,local_c0);
      local_c0->combine_flag = RVar34;
      phVar20 = p_Vid->p_Dec;
      uVar44 = local_c0->structure;
      lVar47 = (long)local_c0->layer_id;
      if (RVar34 == 0) {
        phVar17 = phVar20->dpb_mark;
        bVar68 = 1;
        local_a0 = 2;
        while (((phVar17[(byte)(bVar68 - 1)].out_flag != '\0' ||
                (phVar67 = phVar17 + (byte)(bVar68 - 1), phVar67->top_used != '\0')) ||
               (phVar67->bot_used != '\0'))) {
          if (((0x22 < bVar68) && ((h264d_debug & 2) != 0)) &&
             (_mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,"35 > idx",
                         "dpb_mark_malloc",0x195), (mpp_debug._3_1_ & 0x10) != 0))
          goto LAB_001949a2;
          bVar68 = bVar68 + 1;
        }
        mpp_buf_slot_get_unused(p_Vid->p_Dec->frame_slots,&phVar67->slot_idx);
        if (phVar67->slot_idx < 0) {
          if ((h264d_debug & 4) == 0) goto LAB_00192644;
          pcVar54 = "[dpb_mark_malloc] error, buf_slot has not get.";
          goto LAB_00192658;
        }
        phVar67->out_flag = '\x01';
        pvVar21 = phVar20->curframe;
        MVar8 = (phVar20->cfg->base).out_fmt;
        iVar37 = p_Vid->yuv_format;
        MVar57 = MPP_FMT_YUV_BUTT;
        if (iVar37 == 2) {
          if (p_Vid->bit_depth_luma == 10) {
            mpp_slots_set_prop(phVar20->frame_slots,SLOTS_LEN_ALIGN,rkv_len_align_422);
            MVar57 = MPP_FMT_YUV422SP_10BIT;
          }
          else if (p_Vid->bit_depth_luma == 8) {
            mpp_slots_set_prop(phVar20->frame_slots,SLOTS_LEN_ALIGN,rkv_len_align_422);
            MVar57 = MPP_FMT_YUV422SP;
          }
        }
        else if (iVar37 == 1) {
          MVar55 = MPP_FMT_YUV_BUTT;
          if (p_Vid->bit_depth_luma == 10) {
            MVar55 = MPP_FMT_YUV420SP_10BIT;
          }
          MVar57 = MPP_FMT_YUV420SP;
          if (p_Vid->bit_depth_luma != 8) {
            MVar57 = MVar55;
          }
        }
        else if (iVar37 == 0) {
          MVar57 = (uint)(p_Vid->bit_depth_luma != 8) * 8 + MPP_FMT_YUV400;
        }
        MVar55 = MVar8 & 0xf00000;
        if (MVar55 == MPP_FMT_YUV420SP) {
          bVar75 = true;
          if ((MVar8 >> 0x19 & 1) != 0) {
            MVar57 = MVar57 | 0x2000000;
            goto LAB_0019210c;
          }
        }
        else {
          if (((p_Vid->frame_mbs_only_flag != 0) || (9 < p_Vid->bit_depth_luma)) &&
             ((((phVar20->cfg->base).enable_vproc & 2) == 0 ||
              (((0x780 < p_Vid->width || (0x440 < p_Vid->height)) || (p_Vid->bit_depth_luma != 8))))
             )) {
            mpp_slots_set_prop(phVar20->frame_slots,SLOTS_HOR_ALIGN,hor_align_64);
            MVar57 = MVar57 | MVar55;
          }
LAB_0019210c:
          (phVar20->cfg->base).out_fmt = MVar57;
          bVar75 = (MVar57 & 0xf00000) == MPP_FMT_YUV420SP;
        }
        *(MppFrameFormat *)((long)pvVar21 + 0x68) = MVar57;
        RVar34 = p_Vid->bit_depth_luma;
        iVar37 = p_Vid->width;
        iVar56 = p_Vid->height;
        *(RK_U32 *)((long)pvVar21 + 0x10) = RVar34 * iVar37 + 7 >> 3;
        *(int *)((long)pvVar21 + 0x14) = iVar56;
        uVar22._0_4_ = p_Vid->width_after_crop;
        uVar22._4_4_ = p_Vid->height_after_crop;
        *(undefined8 *)((long)pvVar21 + 8) = uVar22;
        RVar30 = p_Vid->p_Cur->last_dts;
        *(RK_S64 *)((long)pvVar21 + 0x38) = p_Vid->p_Cur->last_pts;
        *(RK_S64 *)((long)pvVar21 + 0x40) = RVar30;
        if (!bVar75) {
          *(undefined8 *)((long)pvVar21 + 0x20) = 0x400000000;
          if (*compat_ext_fbc_buf_size != 0) {
            *(int *)((long)pvVar21 + 0x14) = iVar56 + 0x10;
          }
          *(uint *)((long)pvVar21 + 0x1c) = (undefined4)uVar22 + 0x3f & 0xffffffc0;
          if (*compat_ext_fbc_hdr_256_odd != 0) {
            *(uint *)((long)pvVar21 + 0x1c) = (undefined4)uVar22 + 0xff & 0xfffffe00 | 0x100;
          }
        }
        if (uVar44 == 1) {
          *(undefined4 *)((long)pvVar21 + 0x28) = 7;
        }
        else if (uVar44 == 2) {
          *(undefined4 *)((long)pvVar21 + 0x28) = 0xb;
        }
        else if (uVar44 == 3) {
          *(undefined4 *)((long)pvVar21 + 0x28) = 0;
          if (((RVar34 == 8 && (iVar56 < 0x441 && iVar37 < 0x781)) &
              (byte)(phVar20->cfg->base).enable_vproc >> 1) == 1) {
            *(undefined4 *)((long)pvVar21 + 0x28) = 0xc;
          }
        }
        else {
          if ((h264d_debug & 0x20000) != 0) {
            _mpp_log_l(4,"h264d_init","Unknown interlace mode",(char *)0x0);
          }
          _mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                     "dpb_mark_malloc",0x1fb);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001949a2;
        }
        if (((phVar20->svc_valid != '\0') && ((phVar20->p_Cur->slice).svcExt.valid != 0)) &&
           (*(MppMeta *)((long)pvVar21 + 0xb0) != (MppMeta)0x0)) {
          mpp_meta_set_s32(*(MppMeta *)((long)pvVar21 + 0xb0),KEY_TEMPORAL_ID,
                           (phVar20->p_Cur->slice).svcExt.temporal_id);
        }
        phVar23 = p_Vid->p_Cur->sei;
        if (phVar23 != (h264_sei_t *)0x0) {
          if (((p_Vid->active_sps->vui_parameters_present_flag == 0) ||
              ((p_Vid->active_sps->vui_seq_parameters).pic_struct_present_flag == 0)) ||
             (phVar23->type != 1)) {
            RVar70 = (phVar23->pic_timing).pic_struct;
            if (RVar70 == 0) goto switchD_00192335_default;
          }
          else {
            RVar70 = (phVar23->pic_timing).pic_struct;
          }
          switch(RVar70) {
          case 3:
          case 5:
            *(undefined4 *)((long)pvVar21 + 0x28) = 7;
            if (RVar70 == 4) goto switchD_00192335_caseD_4;
            break;
          case 4:
          case 6:
switchD_00192335_caseD_4:
            *(undefined4 *)((long)pvVar21 + 0x28) = 0xb;
          }
        }
switchD_00192335_default:
        RVar34 = (phVar20->cfg->base).enable_thumbnail;
        if (RVar34 == 0) {
          s = phVar20->curframe;
LAB_00192374:
          RVar34 = 0;
        }
        else {
          s = phVar20->curframe;
          if ((phVar20->hw_info->field_0x6 & 8) == 0) goto LAB_00192374;
        }
        mpp_frame_set_thumbnail_en(s,RVar34);
        phVar12 = p_Vid->active_sps;
        if (phVar12->vui_parameters_present_flag != 0) {
          if (((phVar12->vui_seq_parameters).video_signal_type_present_flag == 0) ||
             ((phVar12->vui_seq_parameters).video_full_range_flag == 0)) {
            local_a0 = 1;
          }
          *(undefined4 *)((long)pvVar21 + 0x54) = local_a0;
          if ((phVar12->vui_seq_parameters).colour_description_present_flag == 0) {
            *(undefined8 *)((long)pvVar21 + 0x58) = 0x200000002;
            *(undefined4 *)((long)pvVar21 + 0x60) = 2;
          }
          else {
            *(RK_U32 *)((long)pvVar21 + 0x58) = (phVar12->vui_seq_parameters).colour_primaries;
            uVar24._0_4_ = (phVar12->vui_seq_parameters).transfer_characteristics;
            uVar24._4_4_ = (phVar12->vui_seq_parameters).matrix_coefficients;
            *(undefined8 *)((long)pvVar21 + 0x5c) = uVar24;
            if ((undefined4)uVar24 == 0x10) {
              *(byte *)((long)pvVar21 + 0x6b) = *(byte *)((long)pvVar21 + 0x6b) | 4;
            }
          }
        }
        phVar25 = p_Vid->p_Cur;
        if ((phVar25->hdr_dynamic != 0) &&
           (phVar25->hdr_dynamic_meta != (MppFrameHdrDynamicMeta *)0x0)) {
          *(MppFrameHdrDynamicMeta **)((long)pvVar21 + 0x90) = phVar25->hdr_dynamic_meta;
          phVar25->hdr_dynamic = 0;
          *(byte *)((long)pvVar21 + 0x6b) = *(byte *)((long)pvVar21 + 0x6b) | 4;
        }
        *(RK_S32 *)((long)pvVar21 + 0x34) = local_c0->poc;
        *(RK_S32 *)((long)pvVar21 + 0x30) = local_c0->layer_id;
        uVar33 = ((ushort)*(undefined4 *)((long)pvVar21 + 0xd8) & 0xfffd) +
                 (ushort)(local_c0->slice_type == 2) * 2;
        *(ushort *)((long)pvVar21 + 0xd8) = uVar33;
        uVar33 = (uVar33 & 0xfffb) + ((ushort)local_c0->idr_flag & 1) * 4;
        *(ushort *)((long)pvVar21 + 0xd8) = uVar33;
        uVar43 = (uVar33 & 0xfff7) + (ushort)(local_c0->used_for_reference == 0) * 8;
        *(ushort *)((long)pvVar21 + 0xd8) = uVar43;
        uVar33 = (ushort)((local_c0->long_term_reference_flag & 1U) << 4);
        *(ushort *)((long)pvVar21 + 0xd8) = uVar43 & 0xffef | uVar33;
        *(ushort *)((long)pvVar21 + 0xd8) =
             uVar43 & 0xffcf | uVar33 | (ushort)(local_c0->slice_type % 5 == 1) << 5;
        mpp_buf_slot_set_prop(phVar20->frame_slots,phVar67->slot_idx,SLOT_FRAME,phVar20->curframe);
        mpp_buf_slot_get_prop
                  (phVar20->frame_slots,phVar67->slot_idx,SLOT_FRAME_PTR,&phVar67->mframe);
        p_Vid->active_dpb_mark[lVar47] = phVar67;
        goto LAB_001924f6;
      }
      phVar67 = p_Vid->active_dpb_mark[lVar47];
LAB_001924f6:
      uVar73 = phVar67->slot_idx;
      if ((int)uVar73 < 0) {
        if ((h264d_debug & 4) == 0) {
LAB_00192644:
          local_b8._0_4_ = MPP_NOK;
          local_c0->mem_mark = (h264_dpb_mark_t *)0x0;
        }
        else {
          pcVar54 = "[dpb_mark_malloc] error, current mark slot idx is nagative.";
LAB_00192658:
          local_b8._0_4_ = MPP_NOK;
          _mpp_log_l(4,"h264d_init",pcVar54,(char *)0x0);
          RVar34 = h264d_debug;
          local_c0->mem_mark = (h264_dpb_mark_t *)0x0;
          if ((RVar34 & 4) != 0) {
            pcVar54 = "Function error(%d).\n";
            uVar62 = 0x2d9;
            goto LAB_00191379;
          }
        }
        goto LAB_00191380;
      }
      if ((uVar44 & 0xfffffffd) == 1) {
        phVar67->top_used = phVar67->top_used + '\x01';
      }
      if ((uVar44 & 0xfffffffe) == 2) {
        phVar67->bot_used = phVar67->bot_used + '\x01';
      }
      if ((h264d_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264d_init",
                   "[DPB_malloc] g_framecnt=%d, com_flag=%d, mark_idx=%d, slot_idx=%d, slice_type=%d, struct=%d, lay_id=%d\n"
                   ,(char *)0x0,(ulong)p_Vid->g_framecnt,(ulong)(uint)local_c0->combine_flag,
                   (ulong)phVar67->mark_idx,(ulong)uVar73,(ulong)(uint)local_c0->slice_type,
                   (ulong)(uint)local_c0->structure,lVar47);
        uVar73 = phVar67->slot_idx;
      }
      p_Vid->p_Dec->in_task->output = uVar73;
      mpp_buf_slot_set_flag(phVar20->frame_slots,uVar73,SLOT_HAL_OUTPUT);
      phVar20->last_frame_slot_idx = phVar67->slot_idx;
      phVar17 = p_Vid->active_dpb_mark[lVar47];
      local_c0->mem_mark = phVar17;
      phVar17->pic = local_c0;
      if ((phVar11->cfg->base).disable_dpb_chk == 0) {
        phVar52 = p_Vid->last_pic;
        if (((phVar52 != (h264_store_pic_t *)0x0) && (uVar44 = local_c0->slice_type, uVar44 != 2))
           && ((currSlice->p_Cur->sps).gaps_in_frame_num_value_allowed_flag == 0)) {
          if (local_c0->combine_flag == 0) {
            uVar73 = currSlice->p_Vid->last_ref_frame_num;
            uVar48 = (ulong)uVar73;
            uVar74 = local_c0->frame_num;
            if (uVar74 == uVar73) {
              bVar75 = false;
            }
            else {
              bVar75 = uVar74 != (uVar73 + 1) % (uint)currSlice->p_Vid->max_frame_num;
              uVar48 = (ulong)uVar74;
            }
          }
          else {
            uVar48 = (ulong)local_c0->frame_num;
            bVar75 = local_c0->frame_num != phVar52->frame_num;
          }
          phVar20 = currSlice->p_Dec;
          pRVar65 = &(phVar20->errctx).cur_err_flag;
          *pRVar65 = *pRVar65 | (uint)bVar75;
          pRVar65 = &(phVar20->errctx).dpb_err_flag;
          *pRVar65 = *pRVar65 | (uint)bVar75;
          if ((h264d_debug & 0x40000) != 0) {
            _mpp_log_l(4,"h264d_init",
                       "[discontinuous] last_slice=%d, cur_slice=%d, last_fnum=%d, cur_fnum=%d, last_poc=%d, cur_poc=%d"
                       ,(char *)0x0,(ulong)(uint)phVar52->slice_type,(ulong)uVar44,
                       (ulong)phVar52->frame_num,uVar48,(ulong)(uint)phVar52->poc,
                       (ulong)(uint)local_c0->poc);
          }
        }
        if ((local_c0->idr_flag != 0) || (local_c0->used_for_reference != 0)) {
          currSlice->p_Vid->last_ref_frame_num = local_c0->frame_num;
        }
      }
      local_c0->mem_malloc_type = Mem_Malloc;
      local_c0->colmv_no_used_flag = '\0';
      p_Vid->dec_pic = local_c0;
      if (((((phVar11->errctx).i_slice_no < 2) && (currSlice->layer_id == 0)) &&
          (currSlice->slice_type == 2)) || (currSlice->idr_flag != 0)) {
        (phVar11->errctx).first_iframe_poc = local_c0->poc;
        (phVar11->errctx).first_iframe_is_output = 0;
      }
      iVar37 = currSlice->layer_id;
      if (((iVar37 != 0) && (currSlice->svc_extension_flag == 0)) &&
         ((currSlice->mvcExt).non_idr_flag == 0)) {
        if ((iVar37 != 1) && ((h264d_debug & 2) != 0)) {
          _mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "currSlice->layer_id == 1","init_picture",0x81c);
          if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_001949a2:
            abort();
          }
          iVar37 = currSlice->layer_id;
          local_c0 = p_Vid->dec_pic;
        }
        local_b8._0_4_ = idr_memory_management(p_Vid->p_Dpb_layer[iVar37],local_c0);
        if ((MPP_RET)local_b8 < MPP_OK) {
          if ((h264d_debug & 4) == 0) {
            return (MPP_RET)local_b8;
          }
          uVar62 = 0x81d;
          goto LAB_001913c3;
        }
      }
      phVar52 = p_Vid->last_pic;
      if (phVar52 != (h264_store_pic_t *)0x0) {
        phVar71 = p_Vid->dec_pic;
        if (((phVar71->poc != 0) && (phVar71->frame_num <= phVar52->frame_num)) &&
           ((phVar71->poc <= phVar52->poc &&
            ((phVar71->slice_type == 2 && (phVar71->structure == 3)))))) {
          if (currSlice->layer_id == 0) {
            local_b8._0_4_ = flush_dpb(p_Vid->p_Dpb_layer[0],1);
            if ((MPP_RET)local_b8 < MPP_OK) {
              if ((h264d_debug & 4) == 0) {
                return (MPP_RET)local_b8;
              }
              uVar62 = 0x827;
              goto LAB_001913c3;
            }
          }
          else {
            local_b8._0_4_ = flush_dpb(p_Vid->p_Dpb_layer[1],2);
            if ((MPP_RET)local_b8 < MPP_OK) {
              if ((h264d_debug & 4) == 0) {
                return (MPP_RET)local_b8;
              }
              uVar62 = 0x829;
              goto LAB_001913c3;
            }
          }
        }
      }
      update_ref_list(p_Vid->p_Dpb_layer[currSlice->layer_id]);
      update_ltref_list(p_Vid->p_Dpb_layer[currSlice->layer_id]);
      phVar26 = currSlice->p_Vid;
      iVar56 = 1;
      bVar68 = (char)phVar26->active_sps->log2_max_frame_num_minus4 + 4U & 0x1f;
      iVar37 = 1 << bVar68;
      phVar13 = currSlice->p_Dpb;
      if (currSlice->idr_flag == 0) {
        iVar46 = currSlice->structure;
        if (iVar46 == 1) {
          iVar56 = 0;
          iVar36 = 1;
        }
        else {
          if (iVar46 == 3) {
            uVar44 = phVar13->ref_frames_in_buffer;
            for (uVar48 = 0; uVar44 != uVar48; uVar48 = uVar48 + 1) {
              phVar63 = phVar13->fs_ref[uVar48];
              if (((phVar63->is_used == 3) &&
                  (phVar52 = phVar63->frame, phVar52->used_for_reference != 0)) &&
                 (phVar52->is_long_term == '\0')) {
                iVar56 = 0;
                if (currSlice->frame_num < (int)phVar63->frame_num) {
                  iVar56 = iVar37;
                }
                iVar56 = phVar63->frame_num - iVar56;
                phVar63->frame_num_wrap = iVar56;
                phVar52->pic_num = iVar56;
              }
            }
            uVar44 = phVar13->ltref_frames_in_buffer;
            for (uVar48 = 0; uVar44 != uVar48; uVar48 = uVar48 + 1) {
              if ((phVar13->fs_ltref[uVar48]->is_used == 3) &&
                 (phVar52 = phVar13->fs_ltref[uVar48]->frame, phVar52->is_long_term != '\0')) {
                phVar52->long_term_pic_num = phVar52->long_term_frame_idx;
              }
            }
            iVar46 = 3;
            goto LAB_00192b76;
          }
          iVar36 = 0;
        }
        uVar44 = phVar13->ref_frames_in_buffer;
        for (uVar48 = 0; uVar44 != uVar48; uVar48 = uVar48 + 1) {
          phVar63 = phVar13->fs_ref[uVar48];
          uVar73 = phVar63->is_reference;
          if (uVar73 != 0) {
            iVar66 = iVar37;
            if ((int)phVar63->frame_num <= currSlice->frame_num) {
              iVar66 = 0 << bVar68;
            }
            iVar66 = phVar63->frame_num - iVar66;
            phVar63->frame_num_wrap = iVar66;
            if ((uVar73 & 1) != 0) {
              phVar63->top_field->pic_num = iVar36 + iVar66 * 2;
            }
            if ((uVar73 & 2) != 0) {
              phVar63->bottom_field->pic_num = iVar56 + iVar66 * 2;
            }
          }
        }
        uVar44 = phVar13->ltref_frames_in_buffer;
        for (uVar48 = 0; uVar44 != uVar48; uVar48 = uVar48 + 1) {
          phVar63 = phVar13->fs_ltref[uVar48];
          uVar73 = phVar63->is_long_term;
          if ((uVar73 & 1) != 0) {
            phVar63->top_field->long_term_pic_num =
                 iVar36 + phVar63->top_field->long_term_frame_idx * 2;
          }
          if ((uVar73 & 2) != 0) {
            phVar63->bottom_field->long_term_pic_num =
                 iVar56 + phVar63->bottom_field->long_term_frame_idx * 2;
          }
        }
LAB_00192b76:
        RVar70 = currSlice->ThisPOC;
        RVar9 = currSlice->anchor_pic_flag;
        pRVar3 = currSlice->listXsizeP;
        pRVar59 = &currSlice->listinterviewidx0;
        currSlice->listinterviewidx0 = 0;
        currSlice->listinterviewidx1 = 0;
        currSlice->listXsizeP[0] = '\0';
        currSlice->listXsizeP[1] = '\0';
        local_b8._0_4_ = MPP_ERR_MALLOC;
        if (iVar46 != 3) {
          ppHVar38 = (H264_FrameStore_t **)
                     mpp_osal_calloc("init_lists_p_slice_mvc",(ulong)phVar13->size << 3);
          ppHVar39 = (H264_FrameStore_t **)
                     mpp_osal_calloc("init_lists_p_slice_mvc",(ulong)phVar13->size << 3);
          if (ppHVar39 != (H264_FrameStore_t **)0x0 && ppHVar38 != (H264_FrameStore_t **)0x0) {
            uVar44 = phVar13->ref_frames_in_buffer;
            iVar37 = 0;
            for (uVar48 = 0; sVar72 = (size_t)iVar37, uVar44 != uVar48; uVar48 = uVar48 + 1) {
              if (phVar13->fs_ref[uVar48]->is_reference != 0) {
                iVar37 = iVar37 + 1;
                ppHVar38[sVar72] = phVar13->fs_ref[uVar48];
              }
            }
            qsort(ppHVar38,sVar72,8,compare_fs_by_frame_num_desc);
            currSlice->listXsizeP[0] = '\0';
            gen_pic_list_from_frame_list
                      (currSlice->structure,ppHVar38,iVar37,currSlice->listP[0],pRVar3,0);
            uVar44 = phVar13->ltref_frames_in_buffer;
            for (uVar48 = 0; uVar44 != uVar48; uVar48 = uVar48 + 1) {
              ppHVar39[uVar48] = phVar13->fs_ltref[uVar48];
            }
            qsort(ppHVar39,(ulong)uVar44,8,compare_fs_by_lt_pic_idx_asc);
            gen_pic_list_from_frame_list
                      (currSlice->structure,ppHVar39,uVar44,currSlice->listP[0],pRVar3,1);
            mpp_osal_free("init_lists_p_slice_mvc",ppHVar38);
            mpp_osal_free("init_lists_p_slice_mvc",ppHVar39);
            goto LAB_00192e40;
          }
          if ((h264d_debug & 1) != 0) {
            _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x468);
          }
          if (ppHVar38 != (H264_FrameStore_t **)0x0) {
            mpp_osal_free("init_lists_p_slice_mvc",ppHVar38);
          }
          if (ppHVar39 != (H264_FrameStore_t **)0x0) {
            mpp_osal_free("init_lists_p_slice_mvc",ppHVar39);
          }
LAB_00192d6b:
          pphVar42 = currSlice->fs_listinterview0;
          if (pphVar42 != (h264_frame_store_t **)0x0) {
LAB_00192ec6:
            mpp_osal_free("init_lists_p_slice_mvc",pphVar42);
            currSlice->fs_listinterview0 = (h264_frame_store_t **)0x0;
            if (MPP_NOK < (MPP_RET)local_b8) goto LAB_00192ee5;
          }
          if ((h264d_debug & 4) == 0) {
            return (MPP_RET)local_b8;
          }
          uVar62 = 0x832;
          goto LAB_001913c3;
        }
        uVar44 = phVar13->ref_frames_in_buffer;
        iVar37 = 0;
        for (uVar48 = 0; sVar72 = (size_t)iVar37, uVar44 != uVar48; uVar48 = uVar48 + 1) {
          if (((phVar13->fs_ref[uVar48]->is_used == 3) &&
              (phVar52 = phVar13->fs_ref[uVar48]->frame, phVar52->used_for_reference != 0)) &&
             (phVar52->is_long_term == '\0')) {
            iVar37 = iVar37 + 1;
            currSlice->listP[0][sVar72] = phVar52;
          }
        }
        qsort(currSlice->listP[0],sVar72,8,compare_pic_by_pic_num_desc);
        currSlice->listXsizeP[0] = (RK_U8)iVar37;
        uVar44 = phVar13->ltref_frames_in_buffer;
        for (uVar48 = 0; lVar47 = (long)iVar37, uVar44 != uVar48; uVar48 = uVar48 + 1) {
          if ((phVar13->fs_ltref[uVar48]->is_used == 3) &&
             (phVar52 = phVar13->fs_ltref[uVar48]->frame, phVar52->is_long_term != '\0')) {
            iVar37 = iVar37 + 1;
            currSlice->listP[0][lVar47] = phVar52;
          }
        }
        qsort(currSlice->listP[0] + currSlice->listXsizeP[0],
              lVar47 - (ulong)currSlice->listXsizeP[0],8,compare_pic_by_lt_pic_num_asc);
        currSlice->listXsizeP[0] = (RK_U8)iVar37;
LAB_00192e40:
        currSlice->listXsizeP[1] = '\0';
        if ((((currSlice->mvcExt).valid == 0) || (phVar26->active_mvc_sps_flag == 0)) ||
           (currSlice->svc_extension_flag != 0)) goto LAB_00192e67;
        RVar10 = currSlice->layer_id;
        ppHVar38 = (H264_FrameStore_t **)
                   mpp_osal_calloc("init_lists_p_slice_mvc",(ulong)phVar13->size << 3);
        currSlice->fs_listinterview0 = ppHVar38;
        if (ppHVar38 == (H264_FrameStore_t **)0x0) {
          if ((h264d_debug & 1) != 0) {
            pcVar54 = "malloc buffer error(%d).\n";
            uVar62 = 0x47f;
            local_b8._0_4_ = MPP_ERR_MALLOC;
LAB_00194844:
            _mpp_log_l(4,"h264d_init",pcVar54,(char *)0x0,uVar62);
          }
          goto LAB_00192d6b;
        }
        if (currSlice->structure == 3) {
          bVar68 = *pRVar3;
          local_b8._0_4_ =
               append_interview_list
                         (phVar26->p_Dpb_layer[1],3,0,ppHVar38,pRVar59,RVar70,RVar10,RVar9);
          if ((MPP_RET)local_b8 < MPP_OK) {
            if ((h264d_debug & 4) != 0) {
              pcVar54 = "Function error(%d).\n";
              uVar62 = 0x483;
              goto LAB_00194844;
            }
            goto LAB_00192d6b;
          }
          uVar44 = currSlice->listinterviewidx0;
          for (uVar48 = 0; uVar44 != uVar48; uVar48 = uVar48 + 1) {
            *(h264_store_pic_t **)
             ((long)currSlice->listP[0] + uVar48 * 8 + (ulong)((uint)bVar68 * 8)) =
                 currSlice->fs_listinterview0[uVar48]->frame;
          }
          *pRVar3 = bVar68 + (char)uVar48;
        }
        else {
          local_b8._0_4_ =
               append_interview_list
                         (phVar26->p_Dpb_layer[1],currSlice->structure,0,ppHVar38,pRVar59,RVar70,
                          RVar10,RVar9);
          if ((MPP_RET)local_b8 < MPP_OK) {
            if ((h264d_debug & 4) != 0) {
              pcVar54 = "Function error(%d).\n";
              uVar62 = 0x48a;
              goto LAB_00194844;
            }
            goto LAB_00192d6b;
          }
          gen_pic_list_from_frame_interview_list
                    (currSlice->structure,currSlice->fs_listinterview0,currSlice->listinterviewidx0,
                     currSlice->listP[0],pRVar3);
        }
LAB_00192e67:
        for (uVar48 = (ulong)currSlice->listXsizeP[0]; uVar48 < 0x21; uVar48 = uVar48 + 1) {
          currSlice->listP[0][uVar48] = phVar26->no_ref_pic;
        }
        for (uVar48 = (ulong)currSlice->listXsizeP[1]; uVar48 < 0x21; uVar48 = uVar48 + 1) {
          currSlice->listP[1][uVar48] = phVar26->no_ref_pic;
        }
        pphVar42 = currSlice->fs_listinterview0;
        if (pphVar42 != (h264_frame_store_t **)0x0) {
          local_b8._0_4_ = MPP_OK;
          goto LAB_00192ec6;
        }
LAB_00192ee5:
        phVar26 = currSlice->p_Vid;
        phVar13 = currSlice->p_Dpb;
        iVar37 = currSlice->structure;
        RVar70 = currSlice->ThisPOC;
        RVar9 = currSlice->anchor_pic_flag;
        pRVar3 = currSlice->listXsizeB;
        currSlice->listXsizeB[0] = '\0';
        currSlice->listXsizeB[1] = '\0';
        list_size = currSlice->listXsizeB + 1;
        currSlice->listinterviewidx0 = 0;
        currSlice->listinterviewidx1 = 0;
        if (iVar37 == 3) {
          uVar44 = phVar13->ref_frames_in_buffer;
          uVar73 = 0;
          for (uVar48 = 0; sVar72 = (size_t)(int)uVar73, uVar44 != uVar48; uVar48 = uVar48 + 1) {
            if ((((phVar13->fs_ref[uVar48]->is_used == 3) &&
                 (phVar52 = phVar13->fs_ref[uVar48]->frame, phVar52->used_for_reference != 0)) &&
                (phVar52->is_long_term == '\0')) && (phVar52->poc <= *pRVar1)) {
              uVar73 = uVar73 + 1;
              currSlice->listB[0][sVar72] = phVar52;
            }
          }
          qsort(currSlice->listB[0],sVar72,8,compare_pic_by_poc_desc);
          uVar44 = phVar13->ref_frames_in_buffer;
          uVar74 = uVar73;
          for (uVar48 = 0; lVar47 = (long)(int)uVar74, uVar44 != uVar48; uVar48 = uVar48 + 1) {
            if (((phVar13->fs_ref[uVar48]->is_used == 3) &&
                (phVar52 = phVar13->fs_ref[uVar48]->frame, phVar52->used_for_reference != 0)) &&
               ((phVar52->is_long_term == '\0' && (*pRVar1 < phVar52->poc)))) {
              uVar74 = uVar74 + 1;
              currSlice->listB[0][lVar47] = phVar52;
            }
          }
          qsort(currSlice->listB[0] + sVar72,(long)(int)(uVar74 - uVar73),8,compare_pic_by_poc_asc);
          uVar48 = 0;
          uVar49 = 0;
          if (0 < (int)uVar73) {
            uVar49 = (ulong)uVar73;
          }
          for (; uVar49 != uVar48; uVar48 = uVar48 + 1) {
            currSlice->listB[1][(lVar47 + uVar48) - sVar72] = currSlice->listB[0][uVar48];
          }
          for (lVar40 = 0; (long)(sVar72 + lVar40) < lVar47; lVar40 = lVar40 + 1) {
            currSlice->listB[1][lVar40] = currSlice->listB[0][sVar72 + lVar40];
          }
          *list_size = (RK_U8)uVar74;
          *pRVar3 = (RK_U8)uVar74;
          uVar44 = phVar13->ltref_frames_in_buffer;
          for (uVar49 = 0; uVar48 = (ulong)(int)uVar74, uVar44 != uVar49; uVar49 = uVar49 + 1) {
            if ((phVar13->fs_ltref[uVar49]->is_used == 3) &&
               (phVar52 = phVar13->fs_ltref[uVar49]->frame, phVar52->is_long_term != '\0')) {
              currSlice->listB[0][uVar48] = phVar52;
              uVar74 = uVar74 + 1;
              currSlice->listB[1][uVar48] = phVar13->fs_ltref[uVar49]->frame;
            }
          }
          qsort(currSlice->listB[0] + currSlice->listXsizeB[0],uVar48 - currSlice->listXsizeB[0],8,
                compare_pic_by_lt_pic_num_asc);
          qsort(currSlice->listB[1] + currSlice->listXsizeB[0],uVar48 - currSlice->listXsizeB[0],8,
                compare_pic_by_lt_pic_num_asc);
          bVar68 = (byte)uVar74;
          currSlice->listXsizeB[1] = bVar68;
          currSlice->listXsizeB[0] = bVar68;
LAB_00193448:
          if (1 < bVar68 && bVar68 == (byte)uVar48) {
            pphVar27 = currSlice->listB[1];
            uVar49 = 0;
            do {
              if ((uVar48 & 0xff) == uVar49) {
                phVar52 = *pphVar27;
                *pphVar27 = pphVar27[1];
                currSlice->listB[1][1] = phVar52;
                break;
              }
              pphVar4 = currSlice->listB[0] + uVar49;
              pphVar5 = pphVar27 + uVar49;
              uVar49 = uVar49 + 1;
            } while (*pphVar4 == *pphVar5);
          }
          if ((((currSlice->mvcExt).valid != 0) && (phVar26->active_mvc_sps_flag != 0)) &&
             (currSlice->svc_extension_flag == 0)) {
            RVar10 = currSlice->layer_id;
            pphVar42 = (h264_frame_store_t **)
                       mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar13->size << 3);
            currSlice->fs_listinterview0 = pphVar42;
            pphVar42 = (h264_frame_store_t **)
                       mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar13->size << 3);
            currSlice->fs_listinterview1 = pphVar42;
            ppHVar38 = currSlice->fs_listinterview0;
            if ((ppHVar38 == (H264_FrameStore_t **)0x0) || (pphVar42 == (h264_frame_store_t **)0x0))
            {
              local_b8._0_4_ = MPP_ERR_MALLOC;
              if ((h264d_debug & 1) != 0) {
                pcVar54 = "malloc buffer error(%d).\n";
                uVar62 = 0x528;
                goto LAB_0019379f;
              }
            }
            else if (currSlice->structure == 3) {
              bVar68 = currSlice->listXsizeB[0];
              local_b8._0_4_ =
                   append_interview_list
                             (phVar26->p_Dpb_layer[1],3,0,ppHVar38,pRVar59,RVar70,RVar10,RVar9);
              if ((MPP_RET)local_b8 < MPP_OK) {
                if ((h264d_debug & 4) != 0) {
                  pcVar54 = "Function error(%d).\n";
                  uVar62 = 0x52c;
LAB_0019379f:
                  _mpp_log_l(4,"h264d_init",pcVar54,(char *)0x0,uVar62);
                }
              }
              else {
                local_b8._0_4_ =
                     append_interview_list
                               (phVar26->p_Dpb_layer[1],currSlice->structure,1,
                                currSlice->fs_listinterview1,&currSlice->listinterviewidx1,RVar70,
                                RVar10,RVar9);
                if (MPP_NOK < (MPP_RET)local_b8) {
                  uVar44 = currSlice->listinterviewidx0;
                  for (uVar48 = 0; uVar44 != uVar48; uVar48 = uVar48 + 1) {
                    *(h264_store_pic_t **)
                     ((long)currSlice->listB[0] + uVar48 * 8 + (ulong)((uint)bVar68 * 8)) =
                         currSlice->fs_listinterview0[uVar48]->frame;
                  }
                  currSlice->listXsizeB[0] = bVar68 + (char)uVar48;
                  bVar68 = currSlice->listXsizeB[1];
                  uVar44 = currSlice->listinterviewidx1;
                  for (uVar48 = 0; uVar44 != uVar48; uVar48 = uVar48 + 1) {
                    currSlice->listB[1][bVar68 + uVar48] =
                         currSlice->fs_listinterview1[uVar48]->frame;
                  }
                  *list_size = (char)uVar48 + bVar68;
                  goto LAB_001934bc;
                }
                if ((h264d_debug & 4) != 0) {
                  pcVar54 = "Function error(%d).\n";
                  uVar62 = 0x52e;
                  goto LAB_0019379f;
                }
              }
            }
            else {
              local_b8._0_4_ =
                   append_interview_list
                             (phVar26->p_Dpb_layer[1],currSlice->structure,0,ppHVar38,pRVar59,RVar70
                              ,RVar10,RVar9);
              if ((MPP_RET)local_b8 < MPP_OK) {
                if ((h264d_debug & 4) != 0) {
                  pcVar54 = "Function error(%d).\n";
                  uVar62 = 0x53b;
                  goto LAB_0019379f;
                }
              }
              else {
                gen_pic_list_from_frame_interview_list
                          (currSlice->structure,currSlice->fs_listinterview0,
                           currSlice->listinterviewidx0,currSlice->listB[0],pRVar3);
                local_b8._0_4_ =
                     append_interview_list
                               (phVar26->p_Dpb_layer[1],currSlice->structure,1,
                                currSlice->fs_listinterview1,&currSlice->listinterviewidx1,RVar70,
                                RVar10,RVar9);
                if (MPP_NOK < (MPP_RET)local_b8) {
                  gen_pic_list_from_frame_interview_list
                            (currSlice->structure,currSlice->fs_listinterview1,
                             currSlice->listinterviewidx1,currSlice->listB[1],list_size);
                  goto LAB_001934bc;
                }
                if ((h264d_debug & 4) != 0) {
                  pcVar54 = "Function error(%d).\n";
                  uVar62 = 0x53f;
                  goto LAB_0019379f;
                }
              }
            }
            goto LAB_001937ab;
          }
LAB_001934bc:
          for (uVar48 = (ulong)currSlice->listXsizeB[0]; uVar48 < 0x21; uVar48 = uVar48 + 1) {
            currSlice->listB[0][uVar48] = phVar26->no_ref_pic;
          }
          for (uVar48 = (ulong)currSlice->listXsizeB[1]; uVar48 < 0x21; uVar48 = uVar48 + 1) {
            currSlice->listB[1][uVar48] = phVar26->no_ref_pic;
          }
          if (currSlice->fs_listinterview0 != (h264_frame_store_t **)0x0) {
            mpp_osal_free("init_lists_b_slice_mvc",currSlice->fs_listinterview0);
          }
          currSlice->fs_listinterview0 = (h264_frame_store_t **)0x0;
          pphVar42 = currSlice->fs_listinterview1;
          if (pphVar42 == (h264_frame_store_t **)0x0) goto LAB_00193808;
          local_b8._0_4_ = MPP_OK;
LAB_001937e9:
          mpp_osal_free("init_lists_b_slice_mvc",pphVar42);
          currSlice->fs_listinterview1 = (h264_frame_store_t **)0x0;
          if (MPP_NOK < (MPP_RET)local_b8) goto LAB_00193808;
        }
        else {
          ppHVar38 = (H264_FrameStore_t **)
                     mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar13->size << 3);
          ppHVar39 = (H264_FrameStore_t **)
                     mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar13->size << 3);
          fs_list = (H264_FrameStore_t **)
                    mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar13->size << 3);
          if (((ppHVar38 != (H264_FrameStore_t **)0x0) && (ppHVar39 != (H264_FrameStore_t **)0x0))
             && (fs_list != (H264_FrameStore_t **)0x0)) {
            *pRVar3 = '\0';
            *list_size = '\x01';
            uVar44 = phVar13->ref_frames_in_buffer;
            uVar73 = 0;
            for (uVar48 = 0; sVar72 = (size_t)(int)uVar73, uVar44 != uVar48; uVar48 = uVar48 + 1) {
              pHVar18 = phVar13->fs_ref[uVar48];
              if ((pHVar18->is_used != 0) && (pHVar18->poc <= *pRVar2)) {
                uVar73 = uVar73 + 1;
                ppHVar38[sVar72] = pHVar18;
              }
            }
            qsort(ppHVar38,sVar72,8,compare_fs_by_poc_desc);
            uVar44 = phVar13->ref_frames_in_buffer;
            uVar74 = uVar73;
            for (uVar48 = 0; lVar47 = (long)(int)uVar74, uVar44 != uVar48; uVar48 = uVar48 + 1) {
              pHVar18 = phVar13->fs_ref[uVar48];
              if ((pHVar18->is_used != 0) && (*pRVar2 < pHVar18->poc)) {
                uVar74 = uVar74 + 1;
                ppHVar38[lVar47] = pHVar18;
              }
            }
            qsort(ppHVar38 + sVar72,(long)(int)(uVar74 - uVar73),8,compare_fs_by_poc_asc);
            uVar48 = 0;
            uVar49 = 0;
            if (0 < (int)uVar73) {
              uVar49 = (ulong)uVar73;
            }
            for (; ppHVar41 = ppHVar39, uVar49 != uVar48; uVar48 = uVar48 + 1) {
              ppHVar39[(long)(int)(uVar74 - uVar73) + uVar48] = ppHVar38[uVar48];
            }
            for (; (long)sVar72 < lVar47; sVar72 = sVar72 + 1) {
              *ppHVar41 = ppHVar38[sVar72];
              ppHVar41 = ppHVar41 + 1;
            }
            currSlice->listXsizeB[0] = '\0';
            currSlice->listXsizeB[1] = '\0';
            gen_pic_list_from_frame_list
                      (currSlice->structure,ppHVar38,uVar74,currSlice->listB[0],pRVar3,0);
            gen_pic_list_from_frame_list
                      (currSlice->structure,ppHVar39,uVar74,currSlice->listB[1],list_size,0);
            uVar44 = phVar13->ltref_frames_in_buffer;
            for (uVar48 = 0; uVar44 != uVar48; uVar48 = uVar48 + 1) {
              fs_list[uVar48] = phVar13->fs_ltref[uVar48];
            }
            qsort(fs_list,(ulong)uVar44,8,compare_fs_by_lt_pic_idx_asc);
            gen_pic_list_from_frame_list
                      (currSlice->structure,fs_list,uVar44,currSlice->listB[0],pRVar3,1);
            gen_pic_list_from_frame_list
                      (currSlice->structure,fs_list,uVar44,currSlice->listB[1],list_size,1);
            mpp_osal_free("init_lists_b_slice_mvc",ppHVar38);
            mpp_osal_free("init_lists_b_slice_mvc",ppHVar39);
            mpp_osal_free("init_lists_b_slice_mvc",fs_list);
            bVar68 = currSlice->listXsizeB[0];
            uVar48 = (ulong)currSlice->listXsizeB[1];
            goto LAB_00193448;
          }
          if ((h264d_debug & 1) != 0) {
            _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x4e7);
          }
          if (ppHVar38 != (H264_FrameStore_t **)0x0) {
            mpp_osal_free("init_lists_b_slice_mvc",ppHVar38);
          }
          if (ppHVar39 != (H264_FrameStore_t **)0x0) {
            mpp_osal_free("init_lists_b_slice_mvc",ppHVar39);
          }
          local_b8._0_4_ = MPP_ERR_MALLOC;
          if (fs_list != (H264_FrameStore_t **)0x0) {
            mpp_osal_free("init_lists_b_slice_mvc",fs_list);
          }
LAB_001937ab:
          if (currSlice->fs_listinterview0 != (h264_frame_store_t **)0x0) {
            mpp_osal_free("init_lists_b_slice_mvc",currSlice->fs_listinterview0);
          }
          currSlice->fs_listinterview0 = (h264_frame_store_t **)0x0;
          pphVar42 = currSlice->fs_listinterview1;
          if (pphVar42 != (h264_frame_store_t **)0x0) goto LAB_001937e9;
        }
        if ((h264d_debug & 4) == 0) {
          return (MPP_RET)local_b8;
        }
        uVar62 = 0x833;
      }
      else {
        if (currSlice->layer_id != 0) {
          iVar46 = currSlice->structure;
          goto LAB_00192b76;
        }
LAB_00193808:
        phVar13 = currSlice->p_Dpb;
        phVar20 = currSlice->p_Dec;
        for (lVar47 = 0; lVar47 != 0x500; lVar47 = lVar47 + 0x50) {
          phVar64 = phVar20->dpb_info;
          *(undefined8 *)((long)&phVar64->refpic + lVar47) = 0;
          *(undefined4 *)((long)&phVar64->BOT_POC + lVar47) = 0;
          *(undefined8 *)((long)&phVar64->field_flag + lVar47) = 0;
          *(undefined8 *)((long)&phVar64->slot_index + lVar47) = 0xffffffff;
          (&phVar64->colmv_is_used)[lVar47] = '\0';
          *(undefined2 *)((long)&phVar64->frame_num + lVar47) = 0;
          *(undefined1 (*) [16])((long)&phVar64->long_term_pic_num + lVar47) = (undefined1  [16])0x0
          ;
        }
        uVar44 = phVar13->ref_frames_in_buffer;
        lVar47 = 0x40;
        for (uVar48 = 0; uVar44 != uVar48; uVar48 = uVar48 + 1) {
          pphVar42 = phVar13->fs_ref;
          phVar63 = pphVar42[uVar48];
          uVar73 = phVar63->is_used;
          if (uVar73 == 3) {
            phVar64 = phVar20->dpb_info;
            *(h264_store_pic_t **)(&phVar64->colmv_is_used + lVar47) = phVar63->frame;
            phVar63 = pphVar42[uVar48];
            phVar52 = phVar63->frame;
            iVar37 = phVar52->iCodingType;
            if (iVar37 == 1) {
              *(RK_S32 *)((long)phVar64 + lVar47 + -0x38) = phVar63->top_field->poc;
              iVar56 = phVar63->bottom_field->poc;
            }
            else {
              iVar56 = phVar52->frame_poc;
              if (iVar56 == phVar52->poc) {
                *(RK_S32 *)((long)phVar64 + lVar47 + -0x38) = phVar52->top_poc;
                iVar56 = phVar52->bottom_poc;
              }
              else {
                *(RK_S32 *)((long)phVar64 + lVar47 + -0x38) = phVar52->top_poc - iVar56;
                iVar56 = phVar52->bottom_poc - iVar56;
              }
            }
            *(int *)((long)phVar64 + lVar47 + -0x34) = iVar56;
            *(uint *)((long)phVar64 + lVar47 + -0x2c) = (uint)(iVar37 == 1);
LAB_0019394f:
            *(RK_S32 *)((long)phVar64 + lVar47 + -0x3c) = phVar52->mem_mark->slot_idx;
            *(bool *)((long)phVar64 + lVar47 + -0x40) = phVar52->colmv_no_used_flag == '\0';
          }
          else {
            if (uVar73 != 0) {
              phVar64 = phVar20->dpb_info;
              if ((uVar73 & 1) == 0) {
                *(h264_store_pic_t **)(&phVar64->colmv_is_used + lVar47) = phVar63->bottom_field;
                *(undefined4 *)((long)phVar64 + lVar47 + -0x38) = 0;
                phVar63 = pphVar42[uVar48];
                phVar52 = phVar63->bottom_field;
                *(RK_S32 *)((long)phVar64 + lVar47 + -0x34) = phVar52->poc;
              }
              else {
                *(h264_store_pic_t **)(&phVar64->colmv_is_used + lVar47) = phVar63->top_field;
                phVar63 = pphVar42[uVar48];
                phVar52 = phVar63->top_field;
                *(RK_S32 *)((long)phVar64 + lVar47 + -0x38) = phVar52->poc;
                *(undefined4 *)((long)phVar64 + lVar47 + -0x34) = 0;
              }
              *(undefined4 *)((long)phVar64 + lVar47 + -0x2c) = 1;
              goto LAB_0019394f;
            }
            phVar64 = phVar20->dpb_info;
          }
          *(short *)((long)phVar64 + lVar47 + -0x30) = (short)phVar63->frame_num;
          *(undefined4 *)((long)phVar64 + lVar47 + -0x28) = 0;
          *(undefined8 *)((long)phVar64 + lVar47 + -0x20) = 0;
          *(RK_S32 *)((long)phVar64 + lVar47 + -0x18) = phVar63->layer_id;
          *(RK_S32 *)((long)phVar64 + lVar47 + -0x14) = phVar63->view_id;
          *(RK_S32 *)((long)phVar64 + lVar47 + -0x10) = phVar63->is_used;
          lVar47 = lVar47 + 0x50;
        }
        uVar73 = phVar13->ltref_frames_in_buffer;
        for (uVar48 = 0; uVar73 != uVar48; uVar48 = uVar48 + 1) {
          uVar49 = uVar44 + uVar48;
          pphVar42 = phVar13->fs_ltref;
          phVar63 = pphVar42[uVar48];
          uVar74 = phVar63->is_used;
          if (uVar74 == 3) {
            phVar64 = phVar20->dpb_info;
            uVar53 = uVar49 & 0xffffffff;
            phVar64[uVar53].refpic = phVar63->frame;
            phVar63 = pphVar42[uVar48];
            phVar52 = phVar63->frame;
            iVar37 = phVar52->iCodingType;
            if (iVar37 == 1) {
              phVar64[uVar53].TOP_POC = phVar63->top_field->poc;
              RVar70 = phVar63->bottom_field->poc;
            }
            else {
              iVar56 = phVar52->frame_poc;
              if (iVar56 == phVar52->poc) {
                phVar64[uVar53].TOP_POC = phVar52->top_poc;
                RVar70 = phVar52->bottom_poc;
              }
              else {
                phVar64[uVar53].TOP_POC = phVar52->top_poc - iVar56;
                RVar70 = phVar52->bottom_poc - iVar56;
              }
            }
            phVar64[uVar53].BOT_POC = RVar70;
            phVar64[uVar53].field_flag = (uint)(iVar37 == 1);
            phVar64[uVar53].slot_index = phVar52->mem_mark->slot_idx;
LAB_00193ad2:
            phVar64[uVar49 & 0xffffffff].colmv_is_used = phVar52->colmv_no_used_flag == '\0';
            phVar64[uVar49 & 0xffffffff].long_term_pic_num = phVar52->long_term_pic_num;
          }
          else {
            if (uVar74 != 0) {
              uVar53 = uVar49 & 0xffffffff;
              phVar64 = phVar20->dpb_info;
              if ((uVar74 & 1) == 0) {
                phVar64[uVar53].refpic = phVar63->bottom_field;
                phVar64[uVar53].TOP_POC = 0;
                phVar63 = pphVar42[uVar48];
                phVar52 = phVar63->bottom_field;
                phVar64[uVar53].BOT_POC = phVar52->poc;
              }
              else {
                phVar64[uVar53].refpic = phVar63->top_field;
                phVar63 = pphVar42[uVar48];
                phVar52 = phVar63->top_field;
                phVar64[uVar53].TOP_POC = phVar52->poc;
                phVar64[uVar53].BOT_POC = 0;
              }
              phVar64[uVar53].field_flag = 1;
              phVar64[uVar53].slot_index = phVar52->mem_mark->slot_idx;
              goto LAB_00193ad2;
            }
            phVar64 = phVar20->dpb_info;
          }
          uVar49 = uVar49 & 0xffffffff;
          RVar34 = phVar63->long_term_frame_idx;
          phVar64[uVar49].frame_num = (RK_U16)RVar34;
          phVar64[uVar49].is_long_term = 1;
          phVar64[uVar49].long_term_frame_idx = RVar34;
          phVar64[uVar49].voidx = phVar63->layer_id;
          phVar64[uVar49].view_id = phVar63->view_id;
          phVar64[uVar49].is_used = phVar63->is_used;
        }
        uVar73 = phVar13->used_size_il;
        uVar44 = uVar44 + (int)uVar48;
        for (lVar47 = 0; (ulong)uVar73 << 3 != lVar47; lVar47 = lVar47 + 8) {
          pphVar42 = phVar13->fs_ilref;
          pRVar65 = *(RK_U32 **)((long)pphVar42 + lVar47);
          RVar34 = *pRVar65;
          if (currSlice->structure == 3) {
            if (RVar34 == 3) {
              if ((pRVar65[10] == 0) && (pRVar65[0xb] == 0)) break;
              phVar64 = phVar20->dpb_info;
              phVar64[uVar44].refpic = *(h264_store_pic_t **)(pRVar65 + 0x14);
              pRVar65 = *(RK_U32 **)((long)pphVar42 + lVar47);
              lVar40 = *(long *)(pRVar65 + 0x14);
              pRVar59 = (RK_S32 *)(lVar40 + 8);
              pRVar69 = (RK_S32 *)(lVar40 + 0xc);
              if (*(char *)(lVar40 + 0xc0) != '\0') {
                pRVar69 = (RK_S32 *)(lVar40 + 0xcc);
                pRVar59 = (RK_S32 *)(lVar40 + 200);
              }
              RVar70 = *pRVar69;
              phVar64[uVar44].TOP_POC = *pRVar59;
              phVar64[uVar44].BOT_POC = RVar70;
              phVar64[uVar44].field_flag = (uint)(*(int *)(lVar40 + 0xb8) == 1);
LAB_00193d3c:
              phVar64[uVar44].slot_index = *(RK_S32 *)(*(long *)(lVar40 + 0xd8) + 0x10);
              phVar64[uVar44].colmv_is_used = *(char *)(lVar40 + 0x44) == '\0';
            }
          }
          else if (RVar34 != 0) {
            if (RVar34 == 3) {
              if (pRVar65[(ulong)(currSlice->structure == 2) + 10] == 0) break;
              phVar64 = phVar20->dpb_info;
              phVar64[uVar44].refpic = *(h264_store_pic_t **)(pRVar65 + 0x16);
              pRVar65 = *(RK_U32 **)((long)pphVar42 + lVar47);
              lVar40 = *(long *)(pRVar65 + 0x16);
              pRVar59 = (RK_S32 *)(lVar40 + 200);
              if (*(char *)(lVar40 + 0xc0) == '\0') {
                pRVar59 = (RK_S32 *)(lVar40 + 8);
              }
              phVar64[uVar44].TOP_POC = *pRVar59;
              lVar40 = *(long *)(pRVar65 + 0x18);
              pRVar59 = (RK_S32 *)(lVar40 + 0xcc);
              if (*(char *)(lVar40 + 0xc0) == '\0') {
                pRVar59 = (RK_S32 *)(lVar40 + 0xc);
              }
              phVar64[uVar44].BOT_POC = *pRVar59;
              lVar40 = *(long *)(pRVar65 + 0x14);
              phVar64[uVar44].field_flag = (uint)(*(int *)(lVar40 + 0xb8) == 1);
              phVar64[uVar44].slot_index = *(RK_S32 *)(*(long *)(lVar40 + 0xd8) + 0x10);
              phVar64[uVar44].colmv_is_used = *(char *)(lVar40 + 0x44) == '\0';
              RVar34 = *pRVar65;
            }
            if ((RVar34 & 1) == 0) {
              if (pRVar65[0xb] == 0) break;
              phVar64 = phVar20->dpb_info;
              phVar64[uVar44].refpic = *(h264_store_pic_t **)(pRVar65 + 0x18);
              phVar64[uVar44].TOP_POC = 0;
              pRVar65 = *(RK_U32 **)((long)pphVar42 + lVar47);
              lVar40 = *(long *)(pRVar65 + 0x18);
              pRVar59 = (RK_S32 *)(lVar40 + 0xcc);
              if (*(char *)(lVar40 + 0xc0) == '\0') {
                pRVar59 = (RK_S32 *)(lVar40 + 0xc);
              }
              phVar64[uVar44].BOT_POC = *pRVar59;
            }
            else {
              if (pRVar65[10] == 0) break;
              phVar64 = phVar20->dpb_info;
              phVar64[uVar44].refpic = *(h264_store_pic_t **)(pRVar65 + 0x16);
              pRVar65 = *(RK_U32 **)((long)pphVar42 + lVar47);
              lVar40 = *(long *)(pRVar65 + 0x16);
              pRVar59 = (RK_S32 *)(lVar40 + 200);
              if (*(char *)(lVar40 + 0xc0) == '\0') {
                pRVar59 = (RK_S32 *)(lVar40 + 8);
              }
              phVar64[uVar44].TOP_POC = *pRVar59;
              phVar64[uVar44].BOT_POC = 0;
            }
            phVar64[uVar44].field_flag = 1;
            goto LAB_00193d3c;
          }
          phVar64 = phVar20->dpb_info;
          phVar64[uVar44].frame_num = (RK_U16)pRVar65[0x10];
          phVar32 = phVar64 + uVar44;
          phVar32->is_long_term = 0;
          phVar32->is_ilt_flag = 1;
          *(undefined8 *)(&phVar32->is_long_term + 2) = 0;
          phVar64[uVar44].voidx = pRVar65[0xe];
          phVar64[uVar44].view_id = pRVar65[9];
          phVar64[uVar44].is_used = *pRVar65;
          uVar44 = uVar44 + 1;
        }
        phVar20 = currSlice->p_Dec;
        memset(phVar20->refpic_info_p,0,0x180);
        memset(phVar20->refpic_info_b[0],0,0x180);
        memset(phVar20->refpic_info_b[1],0,0x180);
        if ((currSlice->idr_flag == 0) || (currSlice->layer_id != 0)) {
          uVar49 = 0;
          for (uVar48 = 0; (uVar48 != 0x20 && (uVar48 < currSlice->listXsizeP[0]));
              uVar48 = uVar48 + 1) {
            phVar52 = currSlice->listP[0][uVar48];
            if (phVar52->is_mmco_5 == '\0') {
              bVar75 = false;
            }
            else {
              bVar75 = phVar52->layer_id == 0 && currSlice->layer_id != 0;
            }
            iVar37 = phVar52->structure;
            if (iVar37 == 1) {
              lVar47 = 8;
              if (bVar75) {
                lVar47 = 200;
              }
            }
            else if (iVar37 == 3) {
              lVar47 = 4;
              if (bVar75) {
                lVar47 = 0xc4;
              }
            }
            else {
              lVar47 = 0xc;
              if (bVar75) {
                lVar47 = 0xcc;
              }
            }
            iVar56 = *(int *)((long)&phVar52->structure + lVar47);
            pRVar59 = &phVar20->dpb_info->TOP_POC;
            for (uVar53 = 0; uVar53 != 0x10; uVar53 = uVar53 + 1) {
              iVar46 = *pRVar59;
              iVar36 = pRVar59[1];
              uVar44 = pRVar59[10];
              if ((currSlice->structure == 3) &&
                 (*(h264_store_pic_t **)(pRVar59 + 0xe) != (h264_store_pic_t *)0x0)) {
                iVar66 = iVar36;
                if (iVar46 < iVar36) {
                  iVar66 = iVar46;
                }
joined_r0x00193ee0:
                if (iVar56 == iVar66) {
LAB_00193ee2:
                  if (phVar52->layer_id == pRVar59[8]) {
                    phVar50 = phVar20->refpic_info_p;
                    phVar50[uVar48].dpb_idx = (RK_S32)uVar53;
                    uVar49 = uVar53 & 0xffffffff;
                    goto LAB_00193f8e;
                  }
                }
              }
              else if (uVar44 == 3) {
                if (iVar56 == iVar46 || iVar56 == iVar36) goto LAB_00193ee2;
              }
              else {
                iVar66 = iVar46;
                if (((uVar44 & 1) != 0) || (iVar66 = iVar36, (uVar44 & 2) != 0))
                goto joined_r0x00193ee0;
              }
              pRVar59 = pRVar59 + 0x14;
            }
            if (((h264d_debug & 2) != 0) && ((int)uVar49 < 0)) {
              _mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "near_dpb_idx >= 0","prepare_init_ref_info",0x728);
              if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001949a2;
              iVar37 = currSlice->listP[0][uVar48]->structure;
            }
            phVar50 = phVar20->refpic_info_p;
            phVar50[uVar48].dpb_idx = (int)uVar49;
            pRVar65 = &(phVar20->errctx).cur_err_flag;
            *(byte *)pRVar65 = (byte)*pRVar65 | 1;
LAB_00193f8e:
            phVar50[uVar48].bottom_flag = (uint)(iVar37 == 2);
            phVar50[uVar48].valid = 1;
          }
          for (lVar47 = 0; lVar47 != 2; lVar47 = lVar47 + 1) {
            local_48 = (undefined1  [16])0x0;
            local_58 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            local_78 = (undefined1  [16])0x0;
            uVar48 = 0;
            for (uVar49 = 0; (uVar49 != 0x20 && (uVar49 < currSlice->listXsizeB[lVar47]));
                uVar49 = uVar49 + 1) {
              phVar52 = currSlice->listB[lVar47][uVar49];
              RVar34 = phVar52->layer_id;
              if (phVar52->is_mmco_5 == '\0') {
                bVar75 = false;
              }
              else {
                bVar75 = RVar34 == 0 && currSlice->layer_id != 0;
              }
              iVar37 = phVar52->structure;
              if (iVar37 == 1) {
                lVar40 = 8;
                lVar58 = 200;
LAB_00194057:
                if (bVar75) {
                  lVar40 = lVar58;
                }
              }
              else {
                if (iVar37 == 3) {
                  lVar40 = 4;
                  lVar58 = 0xc4;
                  goto LAB_00194057;
                }
                lVar40 = 0xc;
                if (bVar75) {
                  lVar40 = 0xcc;
                }
              }
              iVar56 = *(int *)((long)&phVar52->structure + lVar40);
              pRVar59 = &phVar20->dpb_info->TOP_POC;
              for (uVar53 = 0; uVar53 != 0x10; uVar53 = uVar53 + 1) {
                iVar46 = *pRVar59;
                iVar36 = pRVar59[1];
                RVar35 = pRVar59[8];
                uVar44 = pRVar59[10];
                if ((currSlice->structure == 3) &&
                   (*(h264_store_pic_t **)(pRVar59 + 0xe) != (h264_store_pic_t *)0x0)) {
                  if (iVar46 < iVar36) {
                    iVar36 = iVar46;
                  }
                  if (((iVar56 == iVar36) && (RVar34 == RVar35)) &&
                     (*(int *)(local_78 + uVar53 * 4) == 0)) {
                    *(undefined4 *)(local_78 + uVar53 * 4) = 1;
                    goto LAB_001941c7;
                  }
                }
                else if (uVar44 == 3) {
                  if ((iVar56 == iVar46 || iVar56 == iVar36) && (RVar34 == RVar35))
                  goto LAB_001941c7;
                }
                else if ((uVar44 & 1) == 0) {
                  if (((uVar44 & 2) != 0) &&
                     ((iVar56 == iVar36 &&
                      ((RVar34 == RVar35 || (currSlice->bottom_field_flag != 0)))))) {
LAB_001941c7:
                    phVar50 = phVar20->refpic_info_b[lVar47];
                    phVar50[uVar49].dpb_idx = (RK_S32)uVar53;
                    uVar48 = uVar53 & 0xffffffff;
                    goto LAB_001941dc;
                  }
                }
                else if ((iVar56 == iVar46) &&
                        ((RVar34 == RVar35 || (currSlice->bottom_field_flag == 0))))
                goto LAB_001941c7;
                pRVar59 = pRVar59 + 0x14;
              }
              if (((h264d_debug & 2) != 0) && ((int)uVar48 < 0)) {
                _mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "near_dpb_idx >= 0","prepare_init_ref_info",0x767);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001949a2;
                iVar37 = currSlice->listB[lVar47][uVar49]->structure;
              }
              phVar50 = phVar20->refpic_info_b[lVar47];
              phVar50[uVar49].dpb_idx = (int)uVar48;
              pRVar65 = &(phVar20->errctx).cur_err_flag;
              *(byte *)pRVar65 = (byte)*pRVar65 | 1;
LAB_001941dc:
              phVar50[uVar49].bottom_flag = (uint)(iVar37 == 2);
              phVar50[uVar49].valid = 1;
            }
          }
        }
        lVar47 = 4;
        phVar20 = currSlice->p_Dec;
        for (lVar40 = 0; lVar40 != 0x10; lVar40 = lVar40 + 1) {
          phVar64 = phVar20->dpb_info;
          if (*(long *)(&phVar64->field_0x3c + lVar47) == 0) {
            pHVar51 = phVar20->in_task;
LAB_0019426b:
            pHVar51->refer[lVar40] = -1;
          }
          else {
            pHVar51 = phVar20->in_task;
            if (*(int *)(&phVar64->colmv_is_used + lVar47) < 0) goto LAB_0019426b;
            pHVar51->refer[lVar40] = *(int *)(&phVar64->colmv_is_used + lVar47);
            mpp_buf_slot_set_flag
                      (phVar20->frame_slots,*(RK_S32 *)(&phVar64->colmv_is_used + lVar47),
                       SLOT_HAL_INPUT);
            mpp_buf_slot_set_flag
                      (phVar20->frame_slots,*(RK_S32 *)(&phVar20->dpb_info->colmv_is_used + lVar47),
                       SLOT_CODEC_USE);
          }
          lVar47 = lVar47 + 0x50;
        }
        if ((h264d_debug & 0x100) != 0) {
          _mpp_log_l(4,"h264d_init","[DPB_INFO] cur_slot_idx=%d",(char *)0x0,
                     (ulong)(uint)phVar20->in_task->output);
          for (uVar48 = 0; uVar48 != 0x10; uVar48 = uVar48 + 1) {
            if ((-1 < phVar20->in_task->refer[uVar48]) && ((h264d_debug & 0x100) != 0)) {
              _mpp_log_l(4,"h264d_init","[DPB_INFO] ref_slot_idx[%d]=%d",(char *)0x0,
                         uVar48 & 0xffffffff);
            }
          }
        }
        uVar44 = 0;
        for (lVar47 = 0; lVar47 != 0x460; lVar47 = lVar47 + 0x20) {
          phVar17 = phVar20->dpb_mark;
          if ((((&phVar17->out_flag)[lVar47] != '\0') &&
              (iVar37 = *(int *)((long)&phVar17->slot_idx + lVar47), -1 < iVar37)) &&
             (uVar44 = uVar44 + 1, (h264d_debug & 0x100) != 0)) {
            auVar31._8_8_ = 0;
            auVar31._0_8_ = local_78._8_8_;
            local_78 = auVar31 << 0x40;
            mpp_buf_slot_get_prop(phVar20->frame_slots,iVar37,SLOT_FRAME_PTR,local_78);
            uVar48 = 0xff;
            if (((MppFrame)local_78._0_8_ != (MppFrame)0x0) &&
               (buffer = mpp_frame_get_buffer((MppFrame)local_78._0_8_), buffer != (MppBuffer)0x0))
            {
              uVar73 = mpp_buffer_get_fd_with_caller(buffer,"check_refer_dpb_buf_slots");
              uVar48 = (ulong)uVar73;
            }
            if ((h264d_debug & 0x100) != 0) {
              lVar40 = *(long *)((long)&phVar17->pic + lVar47);
              _mpp_log_l(4,"h264d_init",
                         "[DPB_MARK_INFO] slot_idx=%d, top_used=%d, bot_used=%d, out_flag=%d, fd=0x%02x, poc=%d, view_id=%d"
                         ,(char *)0x0,(ulong)*(uint *)((long)&phVar17->slot_idx + lVar47),
                         (ulong)(&phVar17->top_used)[lVar47],(ulong)(&phVar17->bot_used)[lVar47],
                         (ulong)(&phVar17->out_flag)[lVar47],uVar48,(ulong)*(uint *)(lVar40 + 4),
                         (ulong)*(uint *)(lVar40 + 0xbc));
            }
          }
        }
        if ((h264d_debug & 0x100) != 0) {
          _mpp_log_l(4,"h264d_init","[DPB_MARK_INFO] ---------- cur_slot=%d --------------------",
                     (char *)0x0,(ulong)(uint)phVar20->in_task->output);
        }
        RVar34 = phVar20->p_Vid->dpb_size[0];
        RVar35 = phVar20->p_Vid->dpb_size[1];
        uVar73 = 0x12;
        if (RVar35 + RVar34 < 0x11) {
          uVar73 = RVar35 + 2 + RVar34;
        }
        if (uVar44 <= uVar73) {
          pHVar19 = currSlice->p_Dec;
          if (currSlice->slice_type == 2) {
            (pHVar19->errctx).dpb_err_flag = 0;
          }
          else {
            iVar37 = currSlice->slice_type % 5;
            if ((iVar37 != 2) && (iVar37 != 4)) {
              if (currSlice->ref_pic_list_reordering_flag[0] == 0) {
                uVar74 = currSlice->active_pps->num_ref_idx_l0_default_active_minus1 + 1;
                uVar44 = currSlice->num_ref_idx_override_flag;
                uVar73 = uVar74;
                if (uVar44 != 0) {
                  uVar73 = currSlice->num_ref_idx_active[0];
                }
                RVar34 = check_ref_dbp_err(pHVar19,pHVar19->refpic_info_b[(ulong)(iVar37 == 1) - 1],
                                           uVar73);
                uVar60 = (uint)(RVar34 != 0) | (pHVar19->errctx).cur_err_flag;
                (pHVar19->errctx).cur_err_flag = uVar60;
                if ((h264d_debug & 0x1000) != 0) {
                  _mpp_log_l(4,"h264d_init",
                             "list0 dpb: cur_err_flag=%d, pps_refs=%d, over_flag=%d, num_ref_l0=%d\n"
                             ,(char *)0x0,(ulong)uVar60,(ulong)uVar74,(ulong)uVar44,(ulong)uVar73);
                }
              }
              else {
                RVar34 = check_ref_pic_list(currSlice,0);
                pRVar65 = &(pHVar19->errctx).cur_err_flag;
                *pRVar65 = *pRVar65 | RVar34;
              }
            }
            if (currSlice->slice_type % 5 == 1) {
              if (currSlice->ref_pic_list_reordering_flag[1] == 0) {
                uVar74 = currSlice->active_pps->num_ref_idx_l1_default_active_minus1 + 1;
                uVar44 = currSlice->num_ref_idx_override_flag;
                uVar73 = uVar74;
                if (uVar44 != 0) {
                  uVar73 = currSlice->num_ref_idx_active[1];
                }
                RVar34 = check_ref_dbp_err(pHVar19,pHVar19->refpic_info_b[1],uVar73);
                uVar60 = (uint)(RVar34 != 0) | (pHVar19->errctx).cur_err_flag;
                (pHVar19->errctx).cur_err_flag = uVar60;
                if ((h264d_debug & 0x1000) != 0) {
                  _mpp_log_l(4,"h264d_init",
                             "list1 dpb: cur_err_flag=%d, pps_refs=%d, over_flag=%d, num_ref_l1=%d\n"
                             ,(char *)0x0,(ulong)uVar60,(ulong)uVar74,(ulong)uVar44,(ulong)uVar73);
                }
              }
              else {
                RVar34 = check_ref_pic_list(currSlice,1);
                pRVar65 = &(pHVar19->errctx).cur_err_flag;
                *pRVar65 = *pRVar65 | RVar34;
              }
            }
          }
          phVar28 = phVar11->dxva_ctx;
          fill_picparams(currSlice->p_Vid,&phVar28->pp);
          if ((phVar28->pp).scaleing_list_enable_flag == '\0') {
            return MPP_OK;
          }
          prepare_init_scanlist(currSlice);
          fill_scanlist(currSlice->p_Vid,&phVar28->qm);
          return MPP_OK;
        }
        if ((h264d_debug & 1) != 0) {
          _mpp_log_l(4,"h264d_init","[h264d_reset_error]",(char *)0x0);
        }
        h264d_reset(phVar20);
        local_b8._0_4_ = MPP_NOK;
        if ((h264d_debug & 4) == 0) {
          return MPP_NOK;
        }
        uVar62 = 0x838;
      }
      goto LAB_001913c3;
    }
  }
LAB_00191380:
  mpp_mem_pool_put_f("alloc_decpic",p_Vid->pic_st,local_c0);
  p_Vid->dec_pic = (h264_store_pic_t *)0x0;
  if ((h264d_debug & 4) == 0) {
    return (MPP_RET)local_b8;
  }
  uVar62 = 0x814;
LAB_001913c3:
  _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,uVar62);
  return (MPP_RET)local_b8;
}

Assistant:

MPP_RET init_picture(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_DecCtx_t *p_Dec   = currSlice->p_Vid->p_Dec;
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;
    H264dErrCtx_t *p_err   = &p_Dec->errctx;

    //!< discard stream before I_SLICE
    if (!p_err->i_slice_no && p_Vid->recovery.valid_flag && p_Vid->recovery.first_frm_valid &&
        p_Vid->recovery.first_frm_id == currSlice->frame_num) {
        p_err->i_slice_no += (!currSlice->layer_id) ? 1 : 0;
    } else {
        p_err->i_slice_no += ((!currSlice->layer_id) && (H264_I_SLICE == currSlice->slice_type)) ? 1 : 0;
    }

    if (!p_err->i_slice_no) {
        H264D_WARNNING("[Discard] Discard slice before I Slice. \n");
        ret = MPP_NOK;
        goto __FAILED;
    }
    FUN_CHECK(ret = alloc_decpic(currSlice));
    if (((p_err->i_slice_no < 2) && (!currSlice->layer_id) && (H264_I_SLICE == currSlice->slice_type)) ||
        currSlice->idr_flag) {
        p_err->first_iframe_poc = p_Vid->dec_pic->poc; //!< recoder first i frame poc
        p_err->first_iframe_is_output = 0;
    }
    //!< idr_memory_management MVC_layer, idr_flag==1
    if (currSlice->layer_id && !currSlice->svc_extension_flag && !currSlice->mvcExt.non_idr_flag) {
        ASSERT(currSlice->layer_id == 1);
        FUN_CHECK(ret = idr_memory_management(p_Vid->p_Dpb_layer[currSlice->layer_id], p_Vid->dec_pic));
    }

    // if cur pic i frame poc & frame_num <= last pic, flush dpb.
    if (p_Vid->last_pic != NULL && p_Vid->dec_pic->poc != 0) {
        if (p_Vid->last_pic->frame_num >= p_Vid->dec_pic->frame_num
            && p_Vid->last_pic->poc >= p_Vid->dec_pic->poc
            && p_Vid->dec_pic->slice_type == H264_I_SLICE
            && p_Vid->dec_pic->structure == 3) {
            if (currSlice->layer_id == 0) {
                FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[0], 1));
            } else {
                FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[1], 2));
            }
        }
    }
    update_ref_list(p_Vid->p_Dpb_layer[currSlice->layer_id]);
    update_ltref_list(p_Vid->p_Dpb_layer[currSlice->layer_id]);
    update_pic_num(currSlice);
    //!< reorder
    if (!currSlice->idr_flag || currSlice->layer_id) {
        FUN_CHECK(ret = init_lists_p_slice_mvc(currSlice));
        FUN_CHECK(ret = init_lists_b_slice_mvc(currSlice));
    }
    prepare_init_dpb_info(currSlice);
    prepare_init_ref_info(currSlice);

    FUN_CHECK(ret = check_refer_dpb_buf_slots(currSlice));
    check_refer_picture_lists(currSlice);
    {
        H264dDxvaCtx_t *dxva_ctx = p_Dec->dxva_ctx;

        fill_picparams(currSlice->p_Vid, &dxva_ctx->pp);
        if (dxva_ctx->pp.scaleing_list_enable_flag) {
            prepare_init_scanlist(currSlice);
            fill_scanlist(currSlice->p_Vid, &dxva_ctx->qm);
        }
    }

    return ret = MPP_OK;
__FAILED:
    return ret;
}